

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  BBox1f BVar3;
  float fVar4;
  Geometry *pGVar5;
  long lVar6;
  long lVar7;
  RTCRayQueryContext *pRVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  size_t k;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  RTCHitN *pRVar69;
  byte bVar70;
  int iVar71;
  AABBNodeMB4D *node1;
  ulong uVar72;
  ulong uVar73;
  byte bVar74;
  long lVar75;
  undefined1 (*pauVar76) [32];
  byte bVar77;
  ulong uVar78;
  byte bVar79;
  ulong *puVar80;
  NodeRef root;
  bool bVar81;
  ulong uVar82;
  ulong uVar83;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar84 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar88 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar128;
  float fVar129;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar137;
  float fVar141;
  float fVar142;
  undefined1 auVar138 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar149 [32];
  RTCHitN aRVar150 [32];
  float fVar151;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar154 [64];
  float fVar161;
  undefined1 auVar162 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar163 [64];
  float fVar170;
  undefined1 auVar171 [32];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar172 [64];
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 in_ZMM7 [64];
  undefined1 auVar186 [28];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar189 [28];
  undefined1 in_ZMM9 [64];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 in_ZMM10 [64];
  float fVar197;
  undefined1 auVar198 [32];
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 in_ZMM11 [64];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 in_ZMM12 [64];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 in_ZMM13 [64];
  undefined1 auVar219 [28];
  undefined1 in_ZMM14 [64];
  undefined1 auVar220 [28];
  undefined1 in_ZMM15 [64];
  undefined1 auVar221 [64];
  undefined1 in_ZMM20 [64];
  RTCHitN aRVar222 [32];
  undefined1 in_ZMM21 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  vuint<4> *v;
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_true> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d41;
  ulong local_5d40;
  ulong local_5d38;
  RayK<8> *local_5d30;
  undefined4 local_5d24;
  undefined1 local_5d20 [32];
  undefined1 local_5d00 [32];
  undefined8 local_5ce0;
  float fStack_5cd8;
  float fStack_5cd4;
  float fStack_5cd0;
  float fStack_5ccc;
  float fStack_5cc8;
  undefined4 uStack_5cc4;
  float local_5cc0 [4];
  float fStack_5cb0;
  float fStack_5cac;
  float fStack_5ca8;
  undefined4 uStack_5ca4;
  undefined1 (*local_5c88) [32];
  undefined1 local_5c80 [32];
  undefined1 local_5c60 [32];
  BVH *local_5c28;
  Intersectors *local_5c20;
  ulong local_5c18;
  ulong local_5c10;
  ulong local_5c08;
  undefined1 local_5c00 [32];
  RTCHitN local_5be0 [32];
  undefined1 local_5bc0 [8];
  float fStack_5bb8;
  float fStack_5bb4;
  float fStack_5bb0;
  float fStack_5bac;
  float fStack_5ba8;
  undefined1 local_5ba0 [8];
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  uint local_5b00;
  uint uStack_5afc;
  uint uStack_5af8;
  uint uStack_5af4;
  uint uStack_5af0;
  uint uStack_5aec;
  uint uStack_5ae8;
  uint uStack_5ae4;
  uint local_5ae0;
  uint uStack_5adc;
  uint uStack_5ad8;
  uint uStack_5ad4;
  uint uStack_5ad0;
  uint uStack_5acc;
  uint uStack_5ac8;
  uint uStack_5ac4;
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [8];
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  float fStack_5a44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [8];
  float fStack_5958;
  float fStack_5954;
  float fStack_5950;
  float fStack_594c;
  float fStack_5948;
  undefined4 uStack_5944;
  undefined1 local_5940 [8];
  float fStack_5938;
  float fStack_5934;
  float fStack_5930;
  float fStack_592c;
  float fStack_5928;
  undefined4 uStack_5924;
  int local_5920;
  int iStack_591c;
  int iStack_5918;
  int iStack_5914;
  int iStack_5910;
  int iStack_590c;
  int iStack_5908;
  int iStack_5904;
  uint local_5900;
  uint uStack_58fc;
  uint uStack_58f8;
  uint uStack_58f4;
  uint uStack_58f0;
  uint uStack_58ec;
  uint uStack_58e8;
  uint uStack_58e4;
  uint local_58e0;
  uint uStack_58dc;
  uint uStack_58d8;
  uint uStack_58d4;
  uint uStack_58d0;
  uint uStack_58cc;
  uint uStack_58c8;
  uint uStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar114 [32];
  
  local_5808 = (((BVH *)This->ptr)->root).ptr;
  if (local_5808 != 8) {
    auVar89 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar88 = ZEXT816(0) << 0x40;
    uVar82 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar88),5);
    uVar73 = vpcmpeqd_avx512vl(auVar89,(undefined1  [32])valid_i->field_0);
    uVar82 = uVar82 & uVar73;
    bVar79 = (byte)uVar82;
    if (bVar79 != 0) {
      local_5c28 = (BVH *)This->ptr;
      local_5c20 = This;
      local_5a40._0_8_ = *(undefined8 *)ray;
      local_5a40._8_8_ = *(undefined8 *)(ray + 8);
      local_5a40._16_8_ = *(undefined8 *)(ray + 0x10);
      local_5a40._24_8_ = *(undefined8 *)(ray + 0x18);
      local_5a40._32_8_ = *(undefined8 *)(ray + 0x20);
      local_5a40._40_8_ = *(undefined8 *)(ray + 0x28);
      local_5a40._48_8_ = *(undefined8 *)(ray + 0x30);
      local_5a40._56_8_ = *(undefined8 *)(ray + 0x38);
      local_5a40._64_8_ = *(undefined8 *)(ray + 0x40);
      local_5a40._72_8_ = *(undefined8 *)(ray + 0x48);
      local_5a40._80_8_ = *(undefined8 *)(ray + 0x50);
      local_5a40._88_8_ = *(undefined8 *)(ray + 0x58);
      local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
      local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar225 = ZEXT3264(auVar89);
      vandps_avx512vl(local_59e0,auVar89);
      auVar93._8_4_ = 0x219392ef;
      auVar93._0_8_ = 0x219392ef219392ef;
      auVar93._12_4_ = 0x219392ef;
      auVar93._16_4_ = 0x219392ef;
      auVar93._20_4_ = 0x219392ef;
      auVar93._24_4_ = 0x219392ef;
      auVar93._28_4_ = 0x219392ef;
      auVar172 = ZEXT3264(auVar93);
      uVar73 = vcmpps_avx512vl(auVar89,auVar93,1);
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar226 = ZEXT3264(auVar90);
      auVar91 = vdivps_avx512vl(auVar90,local_59e0);
      vandps_avx512vl(local_59c0,auVar89);
      uVar72 = vcmpps_avx512vl(auVar91,auVar93,1);
      auVar92 = vdivps_avx512vl(auVar90,local_59c0);
      vandps_avx512vl(local_59a0,auVar89);
      uVar78 = vcmpps_avx512vl(auVar92,auVar93,1);
      auVar89 = vdivps_avx512vl(auVar90,local_59a0);
      auVar163 = ZEXT3264(CONCAT428(0x5d5e0b6b,
                                    CONCAT424(0x5d5e0b6b,
                                              CONCAT420(0x5d5e0b6b,
                                                        CONCAT416(0x5d5e0b6b,
                                                                  CONCAT412(0x5d5e0b6b,
                                                                            CONCAT48(0x5d5e0b6b,
                                                                                                                                                                          
                                                  0x5d5e0b6b5d5e0b6b)))))));
      bVar81 = (bool)((byte)uVar73 & 1);
      local_5980._0_4_ = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar91._0_4_;
      bVar81 = (bool)((byte)(uVar73 >> 1) & 1);
      local_5980._4_4_ = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar91._4_4_;
      bVar81 = (bool)((byte)(uVar73 >> 2) & 1);
      local_5980._8_4_ = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar91._8_4_;
      bVar81 = (bool)((byte)(uVar73 >> 3) & 1);
      local_5980._12_4_ = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar91._12_4_;
      bVar81 = (bool)((byte)(uVar73 >> 4) & 1);
      local_5980._16_4_ = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar91._16_4_;
      bVar81 = (bool)((byte)(uVar73 >> 5) & 1);
      local_5980._20_4_ = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar91._20_4_;
      bVar81 = (bool)((byte)(uVar73 >> 6) & 1);
      local_5980._24_4_ = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar91._24_4_;
      bVar81 = SUB81(uVar73 >> 7,0);
      local_5980._28_4_ = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar91._28_4_;
      bVar81 = (bool)((byte)uVar72 & 1);
      local_5960._0_4_ = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar92._0_4_;
      bVar81 = (bool)((byte)(uVar72 >> 1) & 1);
      local_5960._4_4_ = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar92._4_4_;
      bVar81 = (bool)((byte)(uVar72 >> 2) & 1);
      fStack_5958 = (float)((uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar92._8_4_);
      bVar81 = (bool)((byte)(uVar72 >> 3) & 1);
      fStack_5954 = (float)((uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar92._12_4_);
      bVar81 = (bool)((byte)(uVar72 >> 4) & 1);
      fStack_5950 = (float)((uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar92._16_4_);
      bVar81 = (bool)((byte)(uVar72 >> 5) & 1);
      fStack_594c = (float)((uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar92._20_4_);
      bVar81 = (bool)((byte)(uVar72 >> 6) & 1);
      fStack_5948 = (float)((uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar92._24_4_);
      bVar81 = SUB81(uVar72 >> 7,0);
      uStack_5944 = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar92._28_4_;
      bVar81 = (bool)((byte)uVar78 & 1);
      local_5940._0_4_ = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar89._0_4_;
      bVar81 = (bool)((byte)(uVar78 >> 1) & 1);
      local_5940._4_4_ = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar89._4_4_;
      bVar81 = (bool)((byte)(uVar78 >> 2) & 1);
      fStack_5938 = (float)((uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar89._8_4_);
      bVar81 = (bool)((byte)(uVar78 >> 3) & 1);
      fStack_5934 = (float)((uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar89._12_4_);
      bVar81 = (bool)((byte)(uVar78 >> 4) & 1);
      fStack_5930 = (float)((uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar89._16_4_);
      bVar81 = (bool)((byte)(uVar78 >> 5) & 1);
      fStack_592c = (float)((uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar89._20_4_);
      bVar81 = (bool)((byte)(uVar78 >> 6) & 1);
      fStack_5928 = (float)((uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar89._24_4_);
      bVar81 = SUB81(uVar78 >> 7,0);
      uStack_5924 = (uint)bVar81 * 0x5d5e0b6b | (uint)!bVar81 * auVar89._28_4_;
      auVar154 = ZEXT3264(_local_5940);
      uVar73 = vcmpps_avx512vl(local_5980,ZEXT1632(auVar88),1);
      auVar89 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_5920 = (uint)((byte)uVar73 & 1) * auVar89._0_4_;
      iStack_591c = (uint)((byte)(uVar73 >> 1) & 1) * auVar89._4_4_;
      iStack_5918 = (uint)((byte)(uVar73 >> 2) & 1) * auVar89._8_4_;
      iStack_5914 = (uint)((byte)(uVar73 >> 3) & 1) * auVar89._12_4_;
      iStack_5910 = (uint)((byte)(uVar73 >> 4) & 1) * auVar89._16_4_;
      iStack_590c = (uint)((byte)(uVar73 >> 5) & 1) * auVar89._20_4_;
      iStack_5908 = (uint)((byte)(uVar73 >> 6) & 1) * auVar89._24_4_;
      iStack_5904 = (uint)(byte)(uVar73 >> 7) * auVar89._28_4_;
      auVar90 = ZEXT1632(auVar88);
      uVar73 = vcmpps_avx512vl(_local_5960,auVar90,5);
      auVar89 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar81 = (bool)((byte)uVar73 & 1);
      bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
      bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
      bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
      bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar73 >> 6) & 1);
      bVar16 = SUB81(uVar73 >> 7,0);
      local_5900 = (uint)bVar81 * auVar89._0_4_ | (uint)!bVar81 * 0x60;
      uStack_58fc = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * 0x60;
      uStack_58f8 = (uint)bVar11 * auVar89._8_4_ | (uint)!bVar11 * 0x60;
      uStack_58f4 = (uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * 0x60;
      uStack_58f0 = (uint)bVar13 * auVar89._16_4_ | (uint)!bVar13 * 0x60;
      uStack_58ec = (uint)bVar14 * auVar89._20_4_ | (uint)!bVar14 * 0x60;
      uStack_58e8 = (uint)bVar15 * auVar89._24_4_ | (uint)!bVar15 * 0x60;
      uStack_58e4 = (uint)bVar16 * auVar89._28_4_ | (uint)!bVar16 * 0x60;
      uVar73 = vcmpps_avx512vl(_local_5940,auVar90,5);
      auVar89 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar81 = (bool)((byte)uVar73 & 1);
      bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
      bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
      bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
      bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar73 >> 6) & 1);
      bVar16 = SUB81(uVar73 >> 7,0);
      local_58e0 = (uint)bVar81 * auVar89._0_4_ | (uint)!bVar81 * 0xa0;
      uStack_58dc = (uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * 0xa0;
      uStack_58d8 = (uint)bVar11 * auVar89._8_4_ | (uint)!bVar11 * 0xa0;
      uStack_58d4 = (uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * 0xa0;
      uStack_58d0 = (uint)bVar13 * auVar89._16_4_ | (uint)!bVar13 * 0xa0;
      uStack_58cc = (uint)bVar14 * auVar89._20_4_ | (uint)!bVar14 * 0xa0;
      uStack_58c8 = (uint)bVar15 * auVar89._24_4_ | (uint)!bVar15 * 0xa0;
      uStack_58c4 = (uint)bVar16 * auVar89._28_4_ | (uint)!bVar16 * 0xa0;
      local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar227 = ZEXT3264(local_4680);
      local_5d24 = (undefined4)uVar82;
      auVar89 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar90);
      local_58c0._0_4_ =
           (uint)(bVar79 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar79 & 1) * local_4680._0_4_;
      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
      local_58c0._4_4_ = (uint)bVar81 * auVar89._4_4_ | (uint)!bVar81 * local_4680._4_4_;
      bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
      local_58c0._8_4_ = (uint)bVar81 * auVar89._8_4_ | (uint)!bVar81 * local_4680._8_4_;
      bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
      local_58c0._12_4_ = (uint)bVar81 * auVar89._12_4_ | (uint)!bVar81 * local_4680._12_4_;
      bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
      local_58c0._16_4_ = (uint)bVar81 * auVar89._16_4_ | (uint)!bVar81 * local_4680._16_4_;
      bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
      local_58c0._20_4_ = (uint)bVar81 * auVar89._20_4_ | (uint)!bVar81 * local_4680._20_4_;
      bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
      local_58c0._24_4_ = (uint)bVar81 * auVar89._24_4_ | (uint)!bVar81 * local_4680._24_4_;
      bVar81 = SUB81(uVar82 >> 7,0);
      local_58c0._28_4_ = (uint)bVar81 * auVar89._28_4_ | (uint)!bVar81 * local_4680._28_4_;
      auVar89 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar90);
      local_58a0._0_4_ = (uint)(bVar79 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar79 & 1) * -0x800000;
      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
      local_58a0._4_4_ = (uint)bVar81 * auVar89._4_4_ | (uint)!bVar81 * -0x800000;
      bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
      local_58a0._8_4_ = (uint)bVar81 * auVar89._8_4_ | (uint)!bVar81 * -0x800000;
      bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
      local_58a0._12_4_ = (uint)bVar81 * auVar89._12_4_ | (uint)!bVar81 * -0x800000;
      bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
      local_58a0._16_4_ = (uint)bVar81 * auVar89._16_4_ | (uint)!bVar81 * -0x800000;
      bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
      local_58a0._20_4_ = (uint)bVar81 * auVar89._20_4_ | (uint)!bVar81 * -0x800000;
      bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
      local_58a0._24_4_ = (uint)bVar81 * auVar89._24_4_ | (uint)!bVar81 * -0x800000;
      bVar81 = SUB81(uVar82 >> 7,0);
      local_58a0._28_4_ = (uint)bVar81 * auVar89._28_4_ | (uint)!bVar81 * -0x800000;
      bVar79 = ~bVar79;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar82 = 7;
      }
      else {
        uVar82 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      local_5d30 = ray + 0x100;
      puVar80 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar76 = (undefined1 (*) [32])local_4640;
      local_4660 = local_58c0;
      local_5c88 = (undefined1 (*) [32])&local_5b00;
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar228 = ZEXT3264(auVar89);
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar229 = ZEXT3264(auVar89);
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar224 = ZEXT3264(auVar89);
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar223 = ZEXT3264(auVar89);
LAB_007c7c56:
      do {
        do {
          root.ptr = puVar80[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_007c92ee;
          puVar80 = puVar80 + -1;
          local_5c80 = pauVar76[-1];
          auVar221 = ZEXT3264(local_5c80);
          pauVar76 = pauVar76 + -1;
          uVar73 = vcmpps_avx512vl(local_5c80,local_58a0,1);
        } while ((char)uVar73 == '\0');
        uVar72 = CONCAT44(0,POPCOUNT((int)uVar73));
        if (uVar82 < uVar72) {
LAB_007c7c9e:
          do {
            lVar75 = -0x20;
            uVar73 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_007c92ee;
              uVar19 = vcmpps_avx512vl(auVar221._0_32_,local_58a0,9);
              if ((char)uVar19 != '\0') {
                local_5c18 = (ulong)((uint)root.ptr & 0xf) - 8;
                bVar70 = bVar79;
                if (local_5c18 != 0) {
                  bVar70 = ~bVar79;
                  uVar73 = 0;
                  do {
                    local_5c10 = uVar73;
                    lVar75 = uVar73 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                    local_5d40 = 0;
                    local_5d38 = (ulong)bVar70;
                    for (uVar73 = local_5d38; (uVar73 & 1) == 0;
                        uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                      local_5d40 = local_5d40 + 1;
                    }
                    uVar73 = 0;
                    bVar77 = bVar70;
                    while( true ) {
                      auVar89 = in_ZMM20._0_32_;
                      auVar219 = in_ZMM14._0_28_;
                      auVar220 = in_ZMM15._0_28_;
                      auVar186 = in_ZMM8._0_28_;
                      auVar189 = in_ZMM9._0_28_;
                      if (*(int *)(lVar75 + 0x50 + uVar73 * 4) == -1) break;
                      local_5c08 = (ulong)*(uint *)(lVar75 + 0x40 + uVar73 * 4);
                      pGVar5 = (context->scene->geometries).items[local_5c08].ptr;
                      BVar3 = pGVar5->time_range;
                      auVar84._8_8_ = 0;
                      auVar84._0_4_ = BVar3.lower;
                      auVar84._4_4_ = BVar3.upper;
                      fVar129 = pGVar5->fnumTimeSegments;
                      auVar138._4_4_ = fVar129;
                      auVar138._0_4_ = fVar129;
                      auVar138._8_4_ = fVar129;
                      auVar138._12_4_ = fVar129;
                      fVar128 = BVar3.lower;
                      auVar147._4_4_ = fVar128;
                      auVar147._0_4_ = fVar128;
                      auVar147._8_4_ = fVar128;
                      auVar147._12_4_ = fVar128;
                      auVar147._16_4_ = fVar128;
                      auVar147._20_4_ = fVar128;
                      auVar147._24_4_ = fVar128;
                      auVar147._28_4_ = fVar128;
                      auVar90 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar147);
                      auVar88 = vmovshdup_avx(auVar84);
                      auVar84 = vsubps_avx(auVar88,auVar84);
                      auVar119._0_4_ = auVar84._0_4_;
                      auVar119._4_4_ = auVar119._0_4_;
                      auVar119._8_4_ = auVar119._0_4_;
                      auVar119._12_4_ = auVar119._0_4_;
                      auVar119._16_4_ = auVar119._0_4_;
                      auVar119._20_4_ = auVar119._0_4_;
                      auVar119._24_4_ = auVar119._0_4_;
                      auVar119._28_4_ = auVar119._0_4_;
                      auVar90 = vdivps_avx(auVar90,auVar119);
                      auVar118._4_4_ = fVar129 * auVar90._4_4_;
                      auVar118._0_4_ = fVar129 * auVar90._0_4_;
                      auVar118._8_4_ = fVar129 * auVar90._8_4_;
                      auVar118._12_4_ = fVar129 * auVar90._12_4_;
                      auVar118._16_4_ = fVar129 * auVar90._16_4_;
                      auVar118._20_4_ = fVar129 * auVar90._20_4_;
                      auVar118._24_4_ = fVar129 * auVar90._24_4_;
                      auVar118._28_4_ = auVar90._28_4_;
                      auVar90 = vroundps_avx(auVar118,1);
                      auVar84 = vaddss_avx512f(auVar138,SUB6416(ZEXT464(0xbf800000),0));
                      auVar139._0_4_ = auVar84._0_4_;
                      auVar139._4_4_ = auVar139._0_4_;
                      auVar139._8_4_ = auVar139._0_4_;
                      auVar139._12_4_ = auVar139._0_4_;
                      auVar139._16_4_ = auVar139._0_4_;
                      auVar139._20_4_ = auVar139._0_4_;
                      auVar139._24_4_ = auVar139._0_4_;
                      auVar139._28_4_ = auVar139._0_4_;
                      auVar90 = vminps_avx(auVar90,auVar139);
                      auVar91 = vmaxps_avx(auVar90,_DAT_01faff00);
                      auVar90 = vcvtps2dq_avx(auVar91);
                      local_5d20 = auVar90;
                      auVar91 = vsubps_avx(auVar118,auVar91);
                      auVar92 = vpbroadcastd_avx512vl();
                      uVar19 = vpcmpeqd_avx512vl(auVar92,auVar90);
                      auVar92 = auVar226._0_32_;
                      if ((byte)((byte)uVar19 | ~bVar70) == 0xff) {
                        lVar6 = *(long *)(*(long *)&pGVar5[2].numPrimitives +
                                         (long)*(int *)(local_5d20 + local_5d40 * 4) * 0x38);
                        lVar7 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 +
                                         (long)*(int *)(local_5d20 + local_5d40 * 4) * 0x38);
                        uVar72 = (ulong)*(uint *)(lVar75 + uVar73 * 4);
                        uVar78 = (ulong)*(uint *)(lVar75 + 0x10 + uVar73 * 4);
                        auVar89 = vsubps_avx512vl(auVar92,auVar91);
                        uVar1 = *(undefined4 *)(lVar7 + uVar72 * 4);
                        auVar22._4_4_ = uVar1;
                        auVar22._0_4_ = uVar1;
                        auVar22._8_4_ = uVar1;
                        auVar22._12_4_ = uVar1;
                        auVar22._16_4_ = uVar1;
                        auVar22._20_4_ = uVar1;
                        auVar22._24_4_ = uVar1;
                        auVar22._28_4_ = uVar1;
                        auVar90 = vmulps_avx512vl(auVar91,auVar22);
                        uVar1 = *(undefined4 *)(lVar7 + 4 + uVar72 * 4);
                        auVar23._4_4_ = uVar1;
                        auVar23._0_4_ = uVar1;
                        auVar23._8_4_ = uVar1;
                        auVar23._12_4_ = uVar1;
                        auVar23._16_4_ = uVar1;
                        auVar23._20_4_ = uVar1;
                        auVar23._24_4_ = uVar1;
                        auVar23._28_4_ = uVar1;
                        auVar93 = vmulps_avx512vl(auVar91,auVar23);
                        uVar1 = *(undefined4 *)(lVar7 + 8 + uVar72 * 4);
                        auVar24._4_4_ = uVar1;
                        auVar24._0_4_ = uVar1;
                        auVar24._8_4_ = uVar1;
                        auVar24._12_4_ = uVar1;
                        auVar24._16_4_ = uVar1;
                        auVar24._20_4_ = uVar1;
                        auVar24._24_4_ = uVar1;
                        auVar24._28_4_ = uVar1;
                        auVar94 = vmulps_avx512vl(auVar91,auVar24);
                        uVar1 = *(undefined4 *)(lVar6 + uVar72 * 4);
                        auVar25._4_4_ = uVar1;
                        auVar25._0_4_ = uVar1;
                        auVar25._8_4_ = uVar1;
                        auVar25._12_4_ = uVar1;
                        auVar25._16_4_ = uVar1;
                        auVar25._20_4_ = uVar1;
                        auVar25._24_4_ = uVar1;
                        auVar25._28_4_ = uVar1;
                        auVar97 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar25);
                        uVar1 = *(undefined4 *)(lVar6 + 4 + uVar72 * 4);
                        auVar26._4_4_ = uVar1;
                        auVar26._0_4_ = uVar1;
                        auVar26._8_4_ = uVar1;
                        auVar26._12_4_ = uVar1;
                        auVar26._16_4_ = uVar1;
                        auVar26._20_4_ = uVar1;
                        auVar26._24_4_ = uVar1;
                        auVar26._28_4_ = uVar1;
                        auVar98 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar26);
                        uVar1 = *(undefined4 *)(lVar6 + 8 + uVar72 * 4);
                        auVar27._4_4_ = uVar1;
                        auVar27._0_4_ = uVar1;
                        auVar27._8_4_ = uVar1;
                        auVar27._12_4_ = uVar1;
                        auVar27._16_4_ = uVar1;
                        auVar27._20_4_ = uVar1;
                        auVar27._24_4_ = uVar1;
                        auVar27._28_4_ = uVar1;
                        auVar99 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar27);
                        uVar1 = *(undefined4 *)(lVar7 + uVar78 * 4);
                        auVar28._4_4_ = uVar1;
                        auVar28._0_4_ = uVar1;
                        auVar28._8_4_ = uVar1;
                        auVar28._12_4_ = uVar1;
                        auVar28._16_4_ = uVar1;
                        auVar28._20_4_ = uVar1;
                        auVar28._24_4_ = uVar1;
                        auVar28._28_4_ = uVar1;
                        auVar90 = vmulps_avx512vl(auVar91,auVar28);
                        uVar1 = *(undefined4 *)(lVar7 + 4 + uVar78 * 4);
                        auVar29._4_4_ = uVar1;
                        auVar29._0_4_ = uVar1;
                        auVar29._8_4_ = uVar1;
                        auVar29._12_4_ = uVar1;
                        auVar29._16_4_ = uVar1;
                        auVar29._20_4_ = uVar1;
                        auVar29._24_4_ = uVar1;
                        auVar29._28_4_ = uVar1;
                        auVar93 = vmulps_avx512vl(auVar91,auVar29);
                        uVar1 = *(undefined4 *)(lVar7 + 8 + uVar78 * 4);
                        auVar30._4_4_ = uVar1;
                        auVar30._0_4_ = uVar1;
                        auVar30._8_4_ = uVar1;
                        auVar30._12_4_ = uVar1;
                        auVar30._16_4_ = uVar1;
                        auVar30._20_4_ = uVar1;
                        auVar30._24_4_ = uVar1;
                        auVar30._28_4_ = uVar1;
                        auVar94 = vmulps_avx512vl(auVar91,auVar30);
                        uVar1 = *(undefined4 *)(lVar6 + uVar78 * 4);
                        auVar31._4_4_ = uVar1;
                        auVar31._0_4_ = uVar1;
                        auVar31._8_4_ = uVar1;
                        auVar31._12_4_ = uVar1;
                        auVar31._16_4_ = uVar1;
                        auVar31._20_4_ = uVar1;
                        auVar31._24_4_ = uVar1;
                        auVar31._28_4_ = uVar1;
                        local_5840 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar31);
                        uVar1 = *(undefined4 *)(lVar6 + 4 + uVar78 * 4);
                        auVar32._4_4_ = uVar1;
                        auVar32._0_4_ = uVar1;
                        auVar32._8_4_ = uVar1;
                        auVar32._12_4_ = uVar1;
                        auVar32._16_4_ = uVar1;
                        auVar32._20_4_ = uVar1;
                        auVar32._24_4_ = uVar1;
                        auVar32._28_4_ = uVar1;
                        local_5860 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar32);
                        uVar1 = *(undefined4 *)(lVar6 + 8 + uVar78 * 4);
                        auVar33._4_4_ = uVar1;
                        auVar33._0_4_ = uVar1;
                        auVar33._8_4_ = uVar1;
                        auVar33._12_4_ = uVar1;
                        auVar33._16_4_ = uVar1;
                        auVar33._20_4_ = uVar1;
                        auVar33._24_4_ = uVar1;
                        auVar33._28_4_ = uVar1;
                        local_5880 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar33);
                        uVar72 = (ulong)*(uint *)(lVar75 + 0x20 + uVar73 * 4);
                        uVar1 = *(undefined4 *)(lVar7 + uVar72 * 4);
                        auVar34._4_4_ = uVar1;
                        auVar34._0_4_ = uVar1;
                        auVar34._8_4_ = uVar1;
                        auVar34._12_4_ = uVar1;
                        auVar34._16_4_ = uVar1;
                        auVar34._20_4_ = uVar1;
                        auVar34._24_4_ = uVar1;
                        auVar34._28_4_ = uVar1;
                        auVar90 = vmulps_avx512vl(auVar91,auVar34);
                        uVar1 = *(undefined4 *)(lVar7 + 4 + uVar72 * 4);
                        auVar35._4_4_ = uVar1;
                        auVar35._0_4_ = uVar1;
                        auVar35._8_4_ = uVar1;
                        auVar35._12_4_ = uVar1;
                        auVar35._16_4_ = uVar1;
                        auVar35._20_4_ = uVar1;
                        auVar35._24_4_ = uVar1;
                        auVar35._28_4_ = uVar1;
                        auVar93 = vmulps_avx512vl(auVar91,auVar35);
                        uVar1 = *(undefined4 *)(lVar7 + 8 + uVar72 * 4);
                        auVar36._4_4_ = uVar1;
                        auVar36._0_4_ = uVar1;
                        auVar36._8_4_ = uVar1;
                        auVar36._12_4_ = uVar1;
                        auVar36._16_4_ = uVar1;
                        auVar36._20_4_ = uVar1;
                        auVar36._24_4_ = uVar1;
                        auVar36._28_4_ = uVar1;
                        auVar94 = vmulps_avx512vl(auVar91,auVar36);
                        uVar1 = *(undefined4 *)(lVar6 + uVar72 * 4);
                        auVar37._4_4_ = uVar1;
                        auVar37._0_4_ = uVar1;
                        auVar37._8_4_ = uVar1;
                        auVar37._12_4_ = uVar1;
                        auVar37._16_4_ = uVar1;
                        auVar37._20_4_ = uVar1;
                        auVar37._24_4_ = uVar1;
                        auVar37._28_4_ = uVar1;
                        _local_5a60 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar37);
                        uVar1 = *(undefined4 *)(lVar6 + 4 + uVar72 * 4);
                        auVar38._4_4_ = uVar1;
                        auVar38._0_4_ = uVar1;
                        auVar38._8_4_ = uVar1;
                        auVar38._12_4_ = uVar1;
                        auVar38._16_4_ = uVar1;
                        auVar38._20_4_ = uVar1;
                        auVar38._24_4_ = uVar1;
                        auVar38._28_4_ = uVar1;
                        local_5a80 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar38);
                        uVar1 = *(undefined4 *)(lVar6 + 8 + uVar72 * 4);
                        auVar39._4_4_ = uVar1;
                        auVar39._0_4_ = uVar1;
                        auVar39._8_4_ = uVar1;
                        auVar39._12_4_ = uVar1;
                        auVar39._16_4_ = uVar1;
                        auVar39._20_4_ = uVar1;
                        auVar39._24_4_ = uVar1;
                        auVar39._28_4_ = uVar1;
                        local_5aa0 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar39);
                        uVar72 = (ulong)*(uint *)(lVar75 + 0x30 + uVar73 * 4);
                        uVar1 = *(undefined4 *)(lVar7 + uVar72 * 4);
                        auVar40._4_4_ = uVar1;
                        auVar40._0_4_ = uVar1;
                        auVar40._8_4_ = uVar1;
                        auVar40._12_4_ = uVar1;
                        auVar40._16_4_ = uVar1;
                        auVar40._20_4_ = uVar1;
                        auVar40._24_4_ = uVar1;
                        auVar40._28_4_ = uVar1;
                        auVar90 = vmulps_avx512vl(auVar91,auVar40);
                        uVar1 = *(undefined4 *)(lVar7 + 4 + uVar72 * 4);
                        auVar41._4_4_ = uVar1;
                        auVar41._0_4_ = uVar1;
                        auVar41._8_4_ = uVar1;
                        auVar41._12_4_ = uVar1;
                        auVar41._16_4_ = uVar1;
                        auVar41._20_4_ = uVar1;
                        auVar41._24_4_ = uVar1;
                        auVar41._28_4_ = uVar1;
                        auVar93 = vmulps_avx512vl(auVar91,auVar41);
                        uVar1 = *(undefined4 *)(lVar7 + 8 + uVar72 * 4);
                        auVar42._4_4_ = uVar1;
                        auVar42._0_4_ = uVar1;
                        auVar42._8_4_ = uVar1;
                        auVar42._12_4_ = uVar1;
                        auVar42._16_4_ = uVar1;
                        auVar42._20_4_ = uVar1;
                        auVar42._24_4_ = uVar1;
                        auVar42._28_4_ = uVar1;
                        auVar91 = vmulps_avx512vl(auVar91,auVar42);
                        uVar1 = *(undefined4 *)(lVar6 + uVar72 * 4);
                        auVar43._4_4_ = uVar1;
                        auVar43._0_4_ = uVar1;
                        auVar43._8_4_ = uVar1;
                        auVar43._12_4_ = uVar1;
                        auVar43._16_4_ = uVar1;
                        auVar43._20_4_ = uVar1;
                        auVar43._24_4_ = uVar1;
                        auVar43._28_4_ = uVar1;
                        local_5c80 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar43);
                        uVar1 = *(undefined4 *)(lVar6 + 4 + uVar72 * 4);
                        auVar44._4_4_ = uVar1;
                        auVar44._0_4_ = uVar1;
                        auVar44._8_4_ = uVar1;
                        auVar44._12_4_ = uVar1;
                        auVar44._16_4_ = uVar1;
                        auVar44._20_4_ = uVar1;
                        auVar44._24_4_ = uVar1;
                        auVar44._28_4_ = uVar1;
                        local_5c60 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar44);
                        uVar1 = *(undefined4 *)(lVar6 + 8 + uVar72 * 4);
                        auVar45._4_4_ = uVar1;
                        auVar45._0_4_ = uVar1;
                        auVar45._8_4_ = uVar1;
                        auVar45._12_4_ = uVar1;
                        auVar45._16_4_ = uVar1;
                        auVar45._20_4_ = uVar1;
                        auVar45._24_4_ = uVar1;
                        auVar45._28_4_ = uVar1;
                        local_5c00 = vfmadd231ps_avx512vl(auVar91,auVar89,auVar45);
                      }
                      else {
                        aRVar150 = (RTCHitN  [32])ZEXT1632(auVar88);
                        pRVar69 = local_5ce0;
                        if (bVar70 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar83 = (ulong)*(uint *)(lVar75 + uVar73 * 4);
                          uVar78 = local_5d38;
                          uVar72 = local_5d40;
                          do {
                            auVar88 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + (long)*(int *)(local_5d20 + uVar72 * 4) *
                                                          0x38) + uVar83 * 4);
                            auVar84 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + 0x38 +
                                                 (long)*(int *)(local_5d20 + uVar72 * 4) * 0x38) +
                                       uVar83 * 4);
                            *(int *)(local_5be0 + uVar72 * 4) = auVar88._0_4_;
                            uVar1 = vextractps_avx(auVar88,1);
                            *(undefined4 *)(local_5bc0 + uVar72 * 4) = uVar1;
                            uVar1 = vextractps_avx(auVar88,2);
                            *(undefined4 *)(local_5ba0 + uVar72 * 4) = uVar1;
                            *(int *)(local_5d00 + uVar72 * 4) = auVar84._0_4_;
                            uVar1 = vextractps_avx(auVar84,1);
                            *(undefined4 *)((long)&local_5ce0 + uVar72 * 4) = uVar1;
                            fVar129 = (float)vextractps_avx(auVar84,2);
                            local_5cc0[uVar72] = fVar129;
                            uVar78 = uVar78 ^ 1L << (uVar72 & 0x3f);
                            uVar72 = 0;
                            for (uVar17 = uVar78; (uVar17 & 1) == 0;
                                uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                              uVar72 = uVar72 + 1;
                            }
                          } while (uVar78 != 0);
                          auVar90._8_8_ = local_5d00._8_8_;
                          auVar90._0_8_ = local_5d00._0_8_;
                          auVar90._16_8_ = local_5d00._16_8_;
                          auVar90._24_8_ = local_5d00._24_8_;
                          aRVar150 = local_5be0;
                          pRVar69 = local_5ce0;
                        }
                        local_5ce0._4_4_ = (float)((ulong)pRVar69 >> 0x20);
                        local_5ce0._0_4_ = SUB84(pRVar69,0);
                        auVar93 = vsubps_avx512vl(auVar92,auVar91);
                        fVar137 = auVar93._0_4_;
                        fVar151 = fVar137 * (float)local_5bc0._0_4_;
                        fVar141 = auVar93._4_4_;
                        fVar155 = fVar141 * (float)local_5bc0._4_4_;
                        fVar142 = auVar93._8_4_;
                        fVar156 = fVar142 * fStack_5bb8;
                        fVar143 = auVar93._12_4_;
                        fVar157 = fVar143 * fStack_5bb4;
                        fVar144 = auVar93._16_4_;
                        fVar158 = fVar144 * fStack_5bb0;
                        fVar145 = auVar93._20_4_;
                        fVar159 = fVar145 * fStack_5bac;
                        fVar146 = auVar93._24_4_;
                        fVar160 = fVar146 * fStack_5ba8;
                        fVar161 = fVar137 * (float)local_5ba0._0_4_;
                        fVar164 = fVar141 * (float)local_5ba0._4_4_;
                        fVar165 = fVar142 * fStack_5b98;
                        fVar166 = fVar143 * fStack_5b94;
                        fVar167 = fVar144 * fStack_5b90;
                        fVar168 = fVar145 * fStack_5b8c;
                        fVar169 = fVar146 * fStack_5b88;
                        fVar129 = auVar91._0_4_;
                        fVar170 = fVar129 * (float)local_5ce0;
                        fVar128 = auVar91._4_4_;
                        fVar173 = fVar128 * local_5ce0._4_4_;
                        fVar132 = auVar91._8_4_;
                        fVar174 = fVar132 * fStack_5cd8;
                        fVar133 = auVar91._12_4_;
                        fVar175 = fVar133 * fStack_5cd4;
                        fVar134 = auVar91._16_4_;
                        fVar176 = fVar134 * fStack_5cd0;
                        fVar135 = auVar91._20_4_;
                        fVar177 = fVar135 * fStack_5ccc;
                        fVar136 = auVar91._24_4_;
                        fVar178 = fVar136 * fStack_5cc8;
                        fVar179 = fVar129 * local_5cc0[0];
                        fVar180 = fVar128 * local_5cc0[1];
                        fVar181 = fVar132 * local_5cc0[2];
                        fVar182 = fVar133 * local_5cc0[3];
                        fVar183 = fVar134 * fStack_5cb0;
                        fVar184 = fVar135 * fStack_5cac;
                        fVar185 = fVar136 * fStack_5ca8;
                        if (bVar70 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar83 = (ulong)*(uint *)(lVar75 + 0x10 + uVar73 * 4);
                          uVar78 = local_5d38;
                          uVar72 = local_5d40;
                          local_5ce0 = pRVar69;
                          do {
                            auVar88 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + (long)*(int *)(local_5d20 + uVar72 * 4) *
                                                          0x38) + uVar83 * 4);
                            auVar84 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + 0x38 +
                                                 (long)*(int *)(local_5d20 + uVar72 * 4) * 0x38) +
                                       uVar83 * 4);
                            *(int *)(local_5be0 + uVar72 * 4) = auVar88._0_4_;
                            uVar1 = vextractps_avx(auVar88,1);
                            *(undefined4 *)(local_5bc0 + uVar72 * 4) = uVar1;
                            uVar1 = vextractps_avx(auVar88,2);
                            *(undefined4 *)(local_5ba0 + uVar72 * 4) = uVar1;
                            *(int *)(local_5d00 + uVar72 * 4) = auVar84._0_4_;
                            uVar1 = vextractps_avx(auVar84,1);
                            *(undefined4 *)((long)&local_5ce0 + uVar72 * 4) = uVar1;
                            fVar190 = (float)vextractps_avx(auVar84,2);
                            local_5cc0[uVar72] = fVar190;
                            uVar78 = uVar78 ^ 1L << (uVar72 & 0x3f);
                            uVar72 = 0;
                            for (uVar17 = uVar78; (uVar17 & 1) == 0;
                                uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                              uVar72 = uVar72 + 1;
                            }
                          } while (uVar78 != 0);
                          auVar189 = local_5be0._0_28_;
                          auVar65._8_8_ = local_5d00._8_8_;
                          auVar65._0_8_ = local_5d00._0_8_;
                          auVar65._16_8_ = local_5d00._16_8_;
                          auVar65._24_8_ = local_5d00._24_8_;
                          auVar186 = auVar65._0_28_;
                          pRVar69 = local_5ce0;
                        }
                        local_5ce0._4_4_ = (float)((ulong)pRVar69 >> 0x20);
                        local_5ce0._0_4_ = SUB84(pRVar69,0);
                        fVar190 = fVar137 * (float)local_5bc0._0_4_;
                        fVar191 = fVar141 * (float)local_5bc0._4_4_;
                        fVar192 = fVar142 * fStack_5bb8;
                        fVar193 = fVar143 * fStack_5bb4;
                        fVar194 = fVar144 * fStack_5bb0;
                        fVar195 = fVar145 * fStack_5bac;
                        fVar196 = fVar146 * fStack_5ba8;
                        fVar197 = fVar137 * (float)local_5ba0._0_4_;
                        fVar199 = fVar141 * (float)local_5ba0._4_4_;
                        fVar200 = fVar142 * fStack_5b98;
                        fVar201 = fVar143 * fStack_5b94;
                        fVar202 = fVar144 * fStack_5b90;
                        fVar203 = fVar145 * fStack_5b8c;
                        fVar204 = fVar146 * fStack_5b88;
                        fVar205 = fVar129 * (float)local_5ce0;
                        fVar206 = fVar128 * local_5ce0._4_4_;
                        fVar207 = fVar132 * fStack_5cd8;
                        fVar208 = fVar133 * fStack_5cd4;
                        fVar209 = fVar134 * fStack_5cd0;
                        fVar210 = fVar135 * fStack_5ccc;
                        fVar211 = fVar136 * fStack_5cc8;
                        fVar212 = fVar129 * local_5cc0[0];
                        fVar213 = fVar128 * local_5cc0[1];
                        fVar214 = fVar132 * local_5cc0[2];
                        fVar215 = fVar133 * local_5cc0[3];
                        fVar216 = fVar134 * fStack_5cb0;
                        fVar217 = fVar135 * fStack_5cac;
                        fVar218 = fVar136 * fStack_5ca8;
                        local_5ce0 = pRVar69;
                        if (bVar70 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar83 = (ulong)*(uint *)(lVar75 + 0x20 + uVar73 * 4);
                          uVar78 = local_5d38;
                          uVar72 = local_5d40;
                          do {
                            auVar88 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + (long)*(int *)(local_5d20 + uVar72 * 4) *
                                                          0x38) + uVar83 * 4);
                            auVar84 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + 0x38 +
                                                 (long)*(int *)(local_5d20 + uVar72 * 4) * 0x38) +
                                       uVar83 * 4);
                            *(int *)(local_5be0 + uVar72 * 4) = auVar88._0_4_;
                            uVar1 = vextractps_avx(auVar88,1);
                            *(undefined4 *)(local_5bc0 + uVar72 * 4) = uVar1;
                            uVar1 = vextractps_avx(auVar88,2);
                            *(undefined4 *)(local_5ba0 + uVar72 * 4) = uVar1;
                            *(int *)(local_5d00 + uVar72 * 4) = auVar84._0_4_;
                            uVar1 = vextractps_avx(auVar84,1);
                            *(undefined4 *)((long)&local_5ce0 + uVar72 * 4) = uVar1;
                            fVar4 = (float)vextractps_avx(auVar84,2);
                            local_5cc0[uVar72] = fVar4;
                            uVar78 = uVar78 ^ 1L << (uVar72 & 0x3f);
                            uVar72 = 0;
                            for (uVar17 = uVar78; (uVar17 & 1) == 0;
                                uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                              uVar72 = uVar72 + 1;
                            }
                          } while (uVar78 != 0);
                          auVar220 = local_5be0._0_28_;
                          auVar66._8_8_ = local_5d00._8_8_;
                          auVar66._0_8_ = local_5d00._0_8_;
                          auVar66._16_8_ = local_5d00._16_8_;
                          auVar66._24_8_ = local_5d00._24_8_;
                          auVar219 = auVar66._0_28_;
                        }
                        auVar94 = vmulps_avx512vl(auVar93,_local_5bc0);
                        auVar95 = vmulps_avx512vl(auVar93,_local_5ba0);
                        auVar67._8_4_ = fStack_5cd8;
                        auVar67._0_8_ = local_5ce0;
                        auVar67._12_4_ = fStack_5cd4;
                        auVar67._16_4_ = fStack_5cd0;
                        auVar67._20_4_ = fStack_5ccc;
                        auVar67._24_4_ = fStack_5cc8;
                        auVar67._28_4_ = uStack_5cc4;
                        auVar96 = vmulps_avx512vl(auVar91,auVar67);
                        auVar68._4_4_ = local_5cc0[1];
                        auVar68._0_4_ = local_5cc0[0];
                        auVar68._8_4_ = local_5cc0[2];
                        auVar68._12_4_ = local_5cc0[3];
                        auVar68._16_4_ = fStack_5cb0;
                        auVar68._20_4_ = fStack_5cac;
                        auVar68._24_4_ = fStack_5ca8;
                        auVar68._28_4_ = uStack_5ca4;
                        auVar117 = vmulps_avx512vl(auVar91,auVar68);
                        aRVar222 = (RTCHitN  [32])in_ZMM21._0_32_;
                        pRVar69 = local_5ce0;
                        if (bVar70 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar83 = (ulong)*(uint *)(lVar75 + 0x30 + uVar73 * 4);
                          uVar78 = local_5d38;
                          uVar72 = local_5d40;
                          do {
                            auVar88 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                          (*(long *)(lVar6 + (long)*(int *)(
                                                  local_5d20 + uVar72 * 4) * 0x38) + uVar83 * 4));
                            auVar84 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                          (*(long *)(lVar6 + 0x38 +
                                                                    (long)*(int *)(local_5d20 +
                                                                                  uVar72 * 4) * 0x38
                                                                    ) + uVar83 * 4));
                            *(int *)(local_5be0 + uVar72 * 4) = auVar88._0_4_;
                            uVar1 = vextractps_avx512f(auVar88,1);
                            *(undefined4 *)(local_5bc0 + uVar72 * 4) = uVar1;
                            uVar1 = vextractps_avx512f(auVar88,2);
                            *(undefined4 *)(local_5ba0 + uVar72 * 4) = uVar1;
                            *(int *)(local_5d00 + uVar72 * 4) = auVar84._0_4_;
                            uVar1 = vextractps_avx512f(auVar84,1);
                            *(undefined4 *)((long)&local_5ce0 + uVar72 * 4) = uVar1;
                            fVar4 = (float)vextractps_avx512f(auVar84,2);
                            local_5cc0[uVar72] = fVar4;
                            uVar78 = uVar78 ^ 1L << (uVar72 & 0x3f);
                            uVar72 = 0;
                            for (uVar17 = uVar78; (uVar17 & 1) == 0;
                                uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                              uVar72 = uVar72 + 1;
                            }
                          } while (uVar78 != 0);
                          auVar89._8_8_ = local_5d00._8_8_;
                          auVar89._0_8_ = local_5d00._0_8_;
                          auVar89._16_8_ = local_5d00._16_8_;
                          auVar89._24_8_ = local_5d00._24_8_;
                          aRVar222 = local_5be0;
                          pRVar69 = local_5ce0;
                        }
                        local_5ce0._4_4_ = (float)((ulong)pRVar69 >> 0x20);
                        local_5ce0._0_4_ = SUB84(pRVar69,0);
                        auVar97._0_4_ = fVar137 * aRVar150._0_4_ + fVar129 * auVar90._0_4_;
                        auVar97._4_4_ = fVar141 * aRVar150._4_4_ + fVar128 * auVar90._4_4_;
                        auVar97._8_4_ = fVar142 * aRVar150._8_4_ + fVar132 * auVar90._8_4_;
                        auVar97._12_4_ = fVar143 * aRVar150._12_4_ + fVar133 * auVar90._12_4_;
                        auVar97._16_4_ = fVar144 * aRVar150._16_4_ + fVar134 * auVar90._16_4_;
                        auVar97._20_4_ = fVar145 * aRVar150._20_4_ + fVar135 * auVar90._20_4_;
                        auVar97._24_4_ = fVar146 * aRVar150._24_4_ + fVar136 * auVar90._24_4_;
                        auVar97._28_4_ = aRVar150._28_4_ + auVar90._28_4_;
                        auVar98._0_4_ = fVar151 + fVar170;
                        auVar98._4_4_ = fVar155 + fVar173;
                        auVar98._8_4_ = fVar156 + fVar174;
                        auVar98._12_4_ = fVar157 + fVar175;
                        auVar98._16_4_ = fVar158 + fVar176;
                        auVar98._20_4_ = fVar159 + fVar177;
                        auVar98._24_4_ = fVar160 + fVar178;
                        auVar98._28_4_ = auVar154._28_4_ + auVar172._28_4_;
                        auVar99._0_4_ = fVar161 + fVar179;
                        auVar99._4_4_ = fVar164 + fVar180;
                        auVar99._8_4_ = fVar165 + fVar181;
                        auVar99._12_4_ = fVar166 + fVar182;
                        auVar99._16_4_ = fVar167 + fVar183;
                        auVar99._20_4_ = fVar168 + fVar184;
                        auVar99._24_4_ = fVar169 + fVar185;
                        fVar151 = auVar163._28_4_;
                        auVar99._28_4_ = fVar151 + in_ZMM7._28_4_;
                        local_5840._0_4_ = auVar189._0_4_ * fVar137 + auVar186._0_4_ * fVar129;
                        local_5840._4_4_ = auVar189._4_4_ * fVar141 + auVar186._4_4_ * fVar128;
                        local_5840._8_4_ = auVar189._8_4_ * fVar142 + auVar186._8_4_ * fVar132;
                        local_5840._12_4_ = auVar189._12_4_ * fVar143 + auVar186._12_4_ * fVar133;
                        local_5840._16_4_ = auVar189._16_4_ * fVar144 + auVar186._16_4_ * fVar134;
                        local_5840._20_4_ = auVar189._20_4_ * fVar145 + auVar186._20_4_ * fVar135;
                        local_5840._24_4_ = auVar189._24_4_ * fVar146 + auVar186._24_4_ * fVar136;
                        local_5840._28_4_ = aRVar150._28_4_ + fVar151;
                        local_5860._0_4_ = fVar190 + fVar205;
                        local_5860._4_4_ = fVar191 + fVar206;
                        local_5860._8_4_ = fVar192 + fVar207;
                        local_5860._12_4_ = fVar193 + fVar208;
                        local_5860._16_4_ = fVar194 + fVar209;
                        local_5860._20_4_ = fVar195 + fVar210;
                        local_5860._24_4_ = fVar196 + fVar211;
                        local_5860._28_4_ = in_ZMM10._28_4_ + in_ZMM12._28_4_;
                        local_5880._0_4_ = fVar197 + fVar212;
                        local_5880._4_4_ = fVar199 + fVar213;
                        local_5880._8_4_ = fVar200 + fVar214;
                        local_5880._12_4_ = fVar201 + fVar215;
                        local_5880._16_4_ = fVar202 + fVar216;
                        local_5880._20_4_ = fVar203 + fVar217;
                        local_5880._24_4_ = fVar204 + fVar218;
                        local_5880._28_4_ = in_ZMM11._28_4_ + in_ZMM13._28_4_;
                        local_5a60._4_4_ = auVar220._4_4_ * fVar141 + auVar219._4_4_ * fVar128;
                        local_5a60._0_4_ = auVar220._0_4_ * fVar137 + auVar219._0_4_ * fVar129;
                        fStack_5a58 = auVar220._8_4_ * fVar142 + auVar219._8_4_ * fVar132;
                        fStack_5a54 = auVar220._12_4_ * fVar143 + auVar219._12_4_ * fVar133;
                        fStack_5a50 = auVar220._16_4_ * fVar144 + auVar219._16_4_ * fVar134;
                        fStack_5a4c = auVar220._20_4_ * fVar145 + auVar219._20_4_ * fVar135;
                        fStack_5a48 = auVar220._24_4_ * fVar146 + auVar219._24_4_ * fVar136;
                        fStack_5a44 = local_5840._28_4_ + fVar151;
                        local_5a80 = vaddps_avx512vl(auVar94,auVar96);
                        local_5aa0 = vaddps_avx512vl(auVar95,auVar117);
                        auVar90 = vmulps_avx512vl(auVar93,(undefined1  [32])aRVar222);
                        auVar61._4_4_ = fVar141 * (float)local_5bc0._4_4_;
                        auVar61._0_4_ = fVar137 * (float)local_5bc0._0_4_;
                        auVar61._8_4_ = fVar142 * fStack_5bb8;
                        auVar61._12_4_ = fVar143 * fStack_5bb4;
                        auVar61._16_4_ = fVar144 * fStack_5bb0;
                        auVar61._20_4_ = fVar145 * fStack_5bac;
                        auVar61._24_4_ = fVar146 * fStack_5ba8;
                        auVar61._28_4_ = fVar151;
                        auVar62._4_4_ = fVar141 * (float)local_5ba0._4_4_;
                        auVar62._0_4_ = fVar137 * (float)local_5ba0._0_4_;
                        auVar62._8_4_ = fVar142 * fStack_5b98;
                        auVar62._12_4_ = fVar143 * fStack_5b94;
                        auVar62._16_4_ = fVar144 * fStack_5b90;
                        auVar62._20_4_ = fVar145 * fStack_5b8c;
                        auVar62._24_4_ = fVar146 * fStack_5b88;
                        auVar62._28_4_ = auVar93._28_4_;
                        auVar89 = vmulps_avx512vl(auVar91,auVar89);
                        local_5c80 = vaddps_avx512vl(auVar90,auVar89);
                        auVar63._4_4_ = fVar128 * local_5ce0._4_4_;
                        auVar63._0_4_ = fVar129 * (float)local_5ce0;
                        auVar63._8_4_ = fVar132 * fStack_5cd8;
                        auVar63._12_4_ = fVar133 * fStack_5cd4;
                        auVar63._16_4_ = fVar134 * fStack_5cd0;
                        auVar63._20_4_ = fVar135 * fStack_5ccc;
                        auVar63._24_4_ = fVar136 * fStack_5cc8;
                        auVar63._28_4_ = auVar90._28_4_;
                        local_5c60 = vaddps_avx512vl(auVar61,auVar63);
                        auVar64._4_4_ = fVar128 * local_5cc0[1];
                        auVar64._0_4_ = fVar129 * local_5cc0[0];
                        auVar64._8_4_ = fVar132 * local_5cc0[2];
                        auVar64._12_4_ = fVar133 * local_5cc0[3];
                        auVar64._16_4_ = fVar134 * fStack_5cb0;
                        auVar64._20_4_ = fVar135 * fStack_5cac;
                        auVar64._24_4_ = fVar136 * fStack_5ca8;
                        auVar64._28_4_ = auVar91._28_4_;
                        local_5c00 = vaddps_avx512vl(auVar62,auVar64);
                        local_5ce0 = pRVar69;
                      }
                      auVar89 = *(undefined1 (*) [32])ray;
                      auVar90 = *(undefined1 (*) [32])(ray + 0x20);
                      auVar91 = *(undefined1 (*) [32])(ray + 0x40);
                      auVar93 = *(undefined1 (*) [32])(ray + 0x80);
                      auVar163 = ZEXT3264(auVar93);
                      auVar94 = *(undefined1 (*) [32])(ray + 0xa0);
                      in_ZMM8 = ZEXT3264(auVar94);
                      auVar95 = *(undefined1 (*) [32])(ray + 0xc0);
                      in_ZMM10 = ZEXT3264(auVar95);
                      auVar96 = vsubps_avx(auVar97,auVar89);
                      auVar117 = vsubps_avx(auVar98,auVar90);
                      auVar120 = vsubps_avx(auVar99,auVar91);
                      in_ZMM9 = ZEXT3264(auVar120);
                      auVar111 = vsubps_avx(local_5840,auVar89);
                      auVar112 = vsubps_avx(local_5860,auVar90);
                      auVar100 = vsubps_avx512vl(local_5880,auVar91);
                      auVar89 = vsubps_avx512vl(local_5c80,auVar89);
                      auVar90 = vsubps_avx512vl(local_5c60,auVar90);
                      auVar91 = vsubps_avx512vl(local_5c00,auVar91);
                      auVar101 = vsubps_avx512vl(auVar89,auVar96);
                      auVar102 = vsubps_avx512vl(auVar90,auVar117);
                      auVar103 = vsubps_avx512vl(auVar91,auVar120);
                      auVar104 = vsubps_avx512vl(auVar96,auVar111);
                      auVar105 = vsubps_avx512vl(auVar117,auVar112);
                      auVar106 = vsubps_avx512vl(auVar120,auVar100);
                      auVar107 = vaddps_avx512vl(auVar89,auVar96);
                      auVar108 = vaddps_avx512vl(auVar90,auVar117);
                      auVar109 = vaddps_avx512vl(auVar91,auVar120);
                      auVar48._4_4_ = auVar103._4_4_ * auVar108._4_4_;
                      auVar48._0_4_ = auVar103._0_4_ * auVar108._0_4_;
                      auVar48._8_4_ = auVar103._8_4_ * auVar108._8_4_;
                      auVar48._12_4_ = auVar103._12_4_ * auVar108._12_4_;
                      auVar48._16_4_ = auVar103._16_4_ * auVar108._16_4_;
                      auVar48._20_4_ = auVar103._20_4_ * auVar108._20_4_;
                      auVar48._24_4_ = auVar103._24_4_ * auVar108._24_4_;
                      auVar48._28_4_ = auVar99._28_4_;
                      auVar84 = vfmsub231ps_fma(auVar48,auVar102,auVar109);
                      auVar49._4_4_ = auVar101._4_4_ * auVar109._4_4_;
                      auVar49._0_4_ = auVar101._0_4_ * auVar109._0_4_;
                      auVar49._8_4_ = auVar101._8_4_ * auVar109._8_4_;
                      auVar49._12_4_ = auVar101._12_4_ * auVar109._12_4_;
                      auVar49._16_4_ = auVar101._16_4_ * auVar109._16_4_;
                      auVar49._20_4_ = auVar101._20_4_ * auVar109._20_4_;
                      auVar49._24_4_ = auVar101._24_4_ * auVar109._24_4_;
                      auVar49._28_4_ = auVar109._28_4_;
                      auVar88 = vfmsub231ps_fma(auVar49,auVar103,auVar107);
                      auVar50._4_4_ = auVar102._4_4_ * auVar107._4_4_;
                      auVar50._0_4_ = auVar102._0_4_ * auVar107._0_4_;
                      auVar50._8_4_ = auVar102._8_4_ * auVar107._8_4_;
                      auVar50._12_4_ = auVar102._12_4_ * auVar107._12_4_;
                      auVar50._16_4_ = auVar102._16_4_ * auVar107._16_4_;
                      auVar50._20_4_ = auVar102._20_4_ * auVar107._20_4_;
                      auVar50._24_4_ = auVar102._24_4_ * auVar107._24_4_;
                      auVar50._28_4_ = auVar107._28_4_;
                      auVar138 = vfmsub231ps_fma(auVar50,auVar101,auVar108);
                      fVar129 = auVar95._0_4_;
                      auVar130._0_4_ = fVar129 * auVar138._0_4_;
                      fVar128 = auVar95._4_4_;
                      auVar130._4_4_ = fVar128 * auVar138._4_4_;
                      fVar132 = auVar95._8_4_;
                      auVar130._8_4_ = fVar132 * auVar138._8_4_;
                      fVar133 = auVar95._12_4_;
                      auVar130._12_4_ = fVar133 * auVar138._12_4_;
                      fVar134 = auVar95._16_4_;
                      auVar130._16_4_ = fVar134 * 0.0;
                      fVar135 = auVar95._20_4_;
                      auVar130._20_4_ = fVar135 * 0.0;
                      fVar136 = auVar95._24_4_;
                      auVar130._24_4_ = fVar136 * 0.0;
                      auVar130._28_4_ = 0;
                      auVar88 = vfmadd231ps_fma(auVar130,auVar94,ZEXT1632(auVar88));
                      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar93,ZEXT1632(auVar84));
                      auVar140._0_4_ = auVar111._0_4_ + auVar96._0_4_;
                      auVar140._4_4_ = auVar111._4_4_ + auVar96._4_4_;
                      auVar140._8_4_ = auVar111._8_4_ + auVar96._8_4_;
                      auVar140._12_4_ = auVar111._12_4_ + auVar96._12_4_;
                      auVar140._16_4_ = auVar111._16_4_ + auVar96._16_4_;
                      auVar140._20_4_ = auVar111._20_4_ + auVar96._20_4_;
                      auVar140._24_4_ = auVar111._24_4_ + auVar96._24_4_;
                      auVar140._28_4_ = auVar111._28_4_ + auVar96._28_4_;
                      auVar148._0_4_ = auVar112._0_4_ + auVar117._0_4_;
                      auVar148._4_4_ = auVar112._4_4_ + auVar117._4_4_;
                      auVar148._8_4_ = auVar112._8_4_ + auVar117._8_4_;
                      auVar148._12_4_ = auVar112._12_4_ + auVar117._12_4_;
                      auVar148._16_4_ = auVar112._16_4_ + auVar117._16_4_;
                      auVar148._20_4_ = auVar112._20_4_ + auVar117._20_4_;
                      auVar148._24_4_ = auVar112._24_4_ + auVar117._24_4_;
                      auVar148._28_4_ = auVar112._28_4_ + auVar117._28_4_;
                      auVar107 = vaddps_avx512vl(auVar120,auVar100);
                      auVar108 = vmulps_avx512vl(auVar148,auVar106);
                      auVar108 = vfmsub231ps_avx512vl(auVar108,auVar105,auVar107);
                      auVar107 = vmulps_avx512vl(auVar107,auVar104);
                      auVar107 = vfmsub231ps_avx512vl(auVar107,auVar106,auVar140);
                      auVar109 = vmulps_avx512vl(auVar140,auVar105);
                      auVar109 = vfmsub231ps_avx512vl(auVar109,auVar104,auVar148);
                      auVar110 = vsubps_avx512vl(auVar111,auVar89);
                      auVar51._4_4_ = fVar128 * auVar109._4_4_;
                      auVar51._0_4_ = fVar129 * auVar109._0_4_;
                      auVar51._8_4_ = fVar132 * auVar109._8_4_;
                      auVar51._12_4_ = fVar133 * auVar109._12_4_;
                      auVar51._16_4_ = fVar134 * auVar109._16_4_;
                      auVar51._20_4_ = fVar135 * auVar109._20_4_;
                      auVar51._24_4_ = fVar136 * auVar109._24_4_;
                      auVar51._28_4_ = auVar109._28_4_;
                      auVar107 = vfmadd231ps_avx512vl(auVar51,auVar94,auVar107);
                      auVar109 = vsubps_avx512vl(auVar112,auVar90);
                      auVar84 = vfmadd231ps_fma(auVar107,auVar93,auVar108);
                      auVar172 = ZEXT1664(auVar84);
                      auVar107 = vsubps_avx512vl(auVar100,auVar91);
                      in_ZMM7 = ZEXT3264(auVar107);
                      auVar89 = vaddps_avx512vl(auVar111,auVar89);
                      auVar90 = vaddps_avx512vl(auVar112,auVar90);
                      auVar91 = vaddps_avx512vl(auVar100,auVar91);
                      auVar111 = vmulps_avx512vl(auVar90,auVar107);
                      auVar111 = vfmsub231ps_avx512vl(auVar111,auVar109,auVar91);
                      auVar91 = vmulps_avx512vl(auVar91,auVar110);
                      auVar91 = vfmsub231ps_avx512vl(auVar91,auVar107,auVar89);
                      auVar52._4_4_ = auVar89._4_4_ * auVar109._4_4_;
                      auVar52._0_4_ = auVar89._0_4_ * auVar109._0_4_;
                      auVar52._8_4_ = auVar89._8_4_ * auVar109._8_4_;
                      auVar52._12_4_ = auVar89._12_4_ * auVar109._12_4_;
                      auVar52._16_4_ = auVar89._16_4_ * auVar109._16_4_;
                      auVar52._20_4_ = auVar89._20_4_ * auVar109._20_4_;
                      auVar52._24_4_ = auVar89._24_4_ * auVar109._24_4_;
                      auVar52._28_4_ = auVar89._28_4_;
                      auVar138 = vfmsub231ps_fma(auVar52,auVar110,auVar90);
                      auVar89 = vmulps_avx512vl(ZEXT1632(auVar138),auVar95);
                      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar94,auVar91);
                      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar93,auVar111);
                      in_ZMM21 = ZEXT3264(auVar89);
                      auVar90 = vaddps_avx512vl(auVar89,ZEXT1632(CONCAT412(auVar88._12_4_ +
                                                                           auVar84._12_4_,
                                                                           CONCAT48(auVar88._8_4_ +
                                                                                    auVar84._8_4_,
                                                                                    CONCAT44(auVar88
                                                  ._4_4_ + auVar84._4_4_,
                                                  auVar88._0_4_ + auVar84._0_4_)))));
                      in_ZMM14 = ZEXT3264(auVar90);
                      auVar100 = auVar225._0_32_;
                      vandps_avx512vl(auVar90,auVar100);
                      in_ZMM15 = ZEXT3264(auVar90);
                      auVar91 = vmulps_avx512vl(auVar90,auVar224._0_32_);
                      auVar111 = vminps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar84));
                      auVar111 = vminps_avx512vl(auVar111,auVar89);
                      auVar112 = vxorps_avx512vl(auVar91,auVar223._0_32_);
                      uVar19 = vcmpps_avx512vl(auVar111,auVar112,5);
                      auVar111 = vmaxps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar84));
                      auVar89 = vmaxps_avx512vl(auVar111,auVar89);
                      in_ZMM20 = ZEXT3264(auVar89);
                      uVar20 = vcmpps_avx512vl(auVar89,auVar91,2);
                      bVar74 = ((byte)uVar19 | (byte)uVar20) & bVar77;
                      if (bVar74 == 0) {
LAB_007c9119:
                        auVar154 = ZEXT3264(auVar117);
                        in_ZMM11 = ZEXT3264(local_5c80);
                        in_ZMM12 = ZEXT3264(local_5c60);
                        in_ZMM13 = ZEXT3264(local_5c00);
                      }
                      else {
                        auVar89 = vmulps_avx512vl(auVar105,auVar103);
                        auVar91 = vmulps_avx512vl(auVar101,auVar106);
                        in_ZMM20 = ZEXT3264(auVar91);
                        auVar111 = vmulps_avx512vl(auVar104,auVar102);
                        in_ZMM21 = ZEXT3264(auVar111);
                        auVar112 = vmulps_avx512vl(auVar109,auVar106);
                        auVar108 = vmulps_avx512vl(auVar104,auVar107);
                        auVar113 = vmulps_avx512vl(auVar110,auVar105);
                        auVar102 = vfmsub213ps_avx512vl(auVar102,auVar106,auVar89);
                        auVar103 = vfmsub213ps_avx512vl(auVar103,auVar104,auVar91);
                        auVar101 = vfmsub213ps_avx512vl(auVar101,auVar105,auVar111);
                        auVar105 = vfmsub213ps_avx512vl(auVar107,auVar105,auVar112);
                        auVar106 = vfmsub213ps_avx512vl(auVar110,auVar106,auVar108);
                        auVar104 = vfmsub213ps_avx512vl(auVar109,auVar104,auVar113);
                        vandps_avx512vl(auVar89,auVar100);
                        vandps_avx512vl(auVar112,auVar100);
                        uVar72 = vcmpps_avx512vl(auVar104,auVar104,1);
                        vandps_avx512vl(auVar91,auVar100);
                        vandps_avx512vl(auVar108,auVar100);
                        uVar78 = vcmpps_avx512vl(auVar104,auVar104,1);
                        vandps_avx512vl(auVar111,auVar100);
                        vandps_avx512vl(auVar113,auVar100);
                        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar223 = ZEXT3264(auVar89);
                        uVar83 = vcmpps_avx512vl(auVar104,auVar104,1);
                        bVar81 = (bool)((byte)uVar72 & 1);
                        auVar85._0_4_ =
                             (uint)bVar81 * auVar102._0_4_ | (uint)!bVar81 * auVar105._0_4_;
                        bVar81 = (bool)((byte)(uVar72 >> 1) & 1);
                        auVar85._4_4_ =
                             (uint)bVar81 * auVar102._4_4_ | (uint)!bVar81 * auVar105._4_4_;
                        bVar81 = (bool)((byte)(uVar72 >> 2) & 1);
                        auVar85._8_4_ =
                             (uint)bVar81 * auVar102._8_4_ | (uint)!bVar81 * auVar105._8_4_;
                        bVar81 = (bool)((byte)(uVar72 >> 3) & 1);
                        auVar85._12_4_ =
                             (uint)bVar81 * auVar102._12_4_ | (uint)!bVar81 * auVar105._12_4_;
                        bVar81 = (bool)((byte)(uVar72 >> 4) & 1);
                        auVar114._16_4_ =
                             (uint)bVar81 * auVar102._16_4_ | (uint)!bVar81 * auVar105._16_4_;
                        auVar114._0_16_ = auVar85;
                        bVar81 = (bool)((byte)(uVar72 >> 5) & 1);
                        auVar114._20_4_ =
                             (uint)bVar81 * auVar102._20_4_ | (uint)!bVar81 * auVar105._20_4_;
                        bVar81 = (bool)((byte)(uVar72 >> 6) & 1);
                        auVar114._24_4_ =
                             (uint)bVar81 * auVar102._24_4_ | (uint)!bVar81 * auVar105._24_4_;
                        bVar81 = SUB81(uVar72 >> 7,0);
                        auVar114._28_4_ =
                             (uint)bVar81 * auVar102._28_4_ | (uint)!bVar81 * auVar105._28_4_;
                        in_ZMM7 = ZEXT3264(auVar114);
                        bVar81 = (bool)((byte)uVar78 & 1);
                        auVar115._0_4_ =
                             (uint)bVar81 * auVar103._0_4_ | (uint)!bVar81 * auVar106._0_4_;
                        bVar81 = (bool)((byte)(uVar78 >> 1) & 1);
                        auVar115._4_4_ =
                             (uint)bVar81 * auVar103._4_4_ | (uint)!bVar81 * auVar106._4_4_;
                        bVar81 = (bool)((byte)(uVar78 >> 2) & 1);
                        auVar115._8_4_ =
                             (uint)bVar81 * auVar103._8_4_ | (uint)!bVar81 * auVar106._8_4_;
                        bVar81 = (bool)((byte)(uVar78 >> 3) & 1);
                        auVar115._12_4_ =
                             (uint)bVar81 * auVar103._12_4_ | (uint)!bVar81 * auVar106._12_4_;
                        bVar81 = (bool)((byte)(uVar78 >> 4) & 1);
                        auVar115._16_4_ =
                             (uint)bVar81 * auVar103._16_4_ | (uint)!bVar81 * auVar106._16_4_;
                        bVar81 = (bool)((byte)(uVar78 >> 5) & 1);
                        auVar115._20_4_ =
                             (uint)bVar81 * auVar103._20_4_ | (uint)!bVar81 * auVar106._20_4_;
                        bVar81 = (bool)((byte)(uVar78 >> 6) & 1);
                        auVar115._24_4_ =
                             (uint)bVar81 * auVar103._24_4_ | (uint)!bVar81 * auVar106._24_4_;
                        bVar81 = SUB81(uVar78 >> 7,0);
                        auVar115._28_4_ =
                             (uint)bVar81 * auVar103._28_4_ | (uint)!bVar81 * auVar106._28_4_;
                        bVar81 = (bool)((byte)uVar83 & 1);
                        auVar116._0_4_ =
                             (float)((uint)bVar81 * auVar101._0_4_ | (uint)!bVar81 * auVar104._0_4_)
                        ;
                        bVar81 = (bool)((byte)(uVar83 >> 1) & 1);
                        auVar116._4_4_ =
                             (float)((uint)bVar81 * auVar101._4_4_ | (uint)!bVar81 * auVar104._4_4_)
                        ;
                        bVar81 = (bool)((byte)(uVar83 >> 2) & 1);
                        auVar116._8_4_ =
                             (float)((uint)bVar81 * auVar101._8_4_ | (uint)!bVar81 * auVar104._8_4_)
                        ;
                        bVar81 = (bool)((byte)(uVar83 >> 3) & 1);
                        auVar116._12_4_ =
                             (float)((uint)bVar81 * auVar101._12_4_ |
                                    (uint)!bVar81 * auVar104._12_4_);
                        bVar81 = (bool)((byte)(uVar83 >> 4) & 1);
                        auVar116._16_4_ =
                             (float)((uint)bVar81 * auVar101._16_4_ |
                                    (uint)!bVar81 * auVar104._16_4_);
                        bVar81 = (bool)((byte)(uVar83 >> 5) & 1);
                        auVar116._20_4_ =
                             (float)((uint)bVar81 * auVar101._20_4_ |
                                    (uint)!bVar81 * auVar104._20_4_);
                        bVar81 = (bool)((byte)(uVar83 >> 6) & 1);
                        auVar116._24_4_ =
                             (float)((uint)bVar81 * auVar101._24_4_ |
                                    (uint)!bVar81 * auVar104._24_4_);
                        bVar81 = SUB81(uVar83 >> 7,0);
                        auVar116._28_4_ =
                             (uint)bVar81 * auVar101._28_4_ | (uint)!bVar81 * auVar104._28_4_;
                        auVar53._4_4_ = fVar128 * auVar116._4_4_;
                        auVar53._0_4_ = fVar129 * auVar116._0_4_;
                        auVar53._8_4_ = fVar132 * auVar116._8_4_;
                        auVar53._12_4_ = fVar133 * auVar116._12_4_;
                        auVar53._16_4_ = fVar134 * auVar116._16_4_;
                        auVar53._20_4_ = fVar135 * auVar116._20_4_;
                        auVar53._24_4_ = fVar136 * auVar116._24_4_;
                        auVar53._28_4_ = auVar95._28_4_;
                        auVar138 = vfmadd213ps_fma(auVar94,auVar115,auVar53);
                        auVar138 = vfmadd213ps_fma(auVar93,auVar114,ZEXT1632(auVar138));
                        auVar94 = ZEXT1632(CONCAT412(auVar138._12_4_ + auVar138._12_4_,
                                                     CONCAT48(auVar138._8_4_ + auVar138._8_4_,
                                                              CONCAT44(auVar138._4_4_ +
                                                                       auVar138._4_4_,
                                                                       auVar138._0_4_ +
                                                                       auVar138._0_4_))));
                        auVar163 = ZEXT3264(auVar94);
                        auVar187._0_4_ = auVar120._0_4_ * auVar116._0_4_;
                        auVar187._4_4_ = auVar120._4_4_ * auVar116._4_4_;
                        auVar187._8_4_ = auVar120._8_4_ * auVar116._8_4_;
                        auVar187._12_4_ = auVar120._12_4_ * auVar116._12_4_;
                        auVar187._16_4_ = auVar120._16_4_ * auVar116._16_4_;
                        auVar187._20_4_ = auVar120._20_4_ * auVar116._20_4_;
                        auVar187._24_4_ = auVar120._24_4_ * auVar116._24_4_;
                        auVar187._28_4_ = 0;
                        auVar138 = vfmadd213ps_fma(auVar117,auVar115,auVar187);
                        auVar86 = vfmadd213ps_fma(auVar96,auVar114,ZEXT1632(auVar138));
                        auVar117 = vrcp14ps_avx512vl(auVar94);
                        auVar93 = vxorps_avx512vl(auVar94,auVar89);
                        in_ZMM8 = ZEXT3264(auVar93);
                        auVar89 = vfnmadd213ps_avx512vl(auVar117,auVar94,auVar92);
                        auVar138 = vfmadd132ps_fma(auVar89,auVar117,auVar117);
                        in_ZMM9 = ZEXT1664(auVar138);
                        auVar89 = *(undefined1 (*) [32])(ray + 0x100);
                        in_ZMM10 = ZEXT3264(auVar89);
                        auVar91 = ZEXT1632(CONCAT412(auVar138._12_4_ *
                                                     (auVar86._12_4_ + auVar86._12_4_),
                                                     CONCAT48(auVar138._8_4_ *
                                                              (auVar86._8_4_ + auVar86._8_4_),
                                                              CONCAT44(auVar138._4_4_ *
                                                                       (auVar86._4_4_ +
                                                                       auVar86._4_4_),
                                                                       auVar138._0_4_ *
                                                                       (auVar86._0_4_ +
                                                                       auVar86._0_4_)))));
                        uVar19 = vcmpps_avx512vl(auVar91,auVar89,2);
                        uVar20 = vcmpps_avx512vl(auVar91,*(undefined1 (*) [32])(ray + 0x60),0xd);
                        uVar21 = vcmpps_avx512vl(auVar94,auVar93,4);
                        bVar74 = bVar74 & (byte)uVar19 & (byte)uVar20 & (byte)uVar21;
                        if (bVar74 == 0) goto LAB_007c9119;
                        uVar2 = pGVar5->mask;
                        auVar152._4_4_ = uVar2;
                        auVar152._0_4_ = uVar2;
                        auVar152._8_4_ = uVar2;
                        auVar152._12_4_ = uVar2;
                        auVar152._16_4_ = uVar2;
                        auVar152._20_4_ = uVar2;
                        auVar152._24_4_ = uVar2;
                        auVar152._28_4_ = uVar2;
                        auVar154 = ZEXT3264(auVar152);
                        uVar19 = vptestmd_avx512vl(auVar152,*(undefined1 (*) [32])(ray + 0x120));
                        bVar74 = bVar74 & (byte)uVar19;
                        in_ZMM11 = ZEXT3264(local_5c80);
                        in_ZMM12 = ZEXT3264(local_5c60);
                        in_ZMM13 = ZEXT3264(local_5c00);
                        if (bVar74 != 0) {
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar47._8_4_ = 0x219392ef;
                            auVar47._0_8_ = 0x219392ef219392ef;
                            auVar47._12_4_ = 0x219392ef;
                            auVar47._16_4_ = 0x219392ef;
                            auVar47._20_4_ = 0x219392ef;
                            auVar47._24_4_ = 0x219392ef;
                            auVar47._28_4_ = 0x219392ef;
                            uVar72 = vcmpps_avx512vl(auVar90,auVar47,5);
                            auVar94 = vrcp14ps_avx512vl(auVar90);
                            auVar95 = vfnmadd213ps_avx512vl(auVar90,auVar94,auVar92);
                            auVar95 = vfmadd132ps_avx512vl(auVar95,auVar94,auVar94);
                            fVar136 = (float)((uint)((byte)uVar72 & 1) * auVar95._0_4_);
                            fVar129 = (float)((uint)((byte)(uVar72 >> 1) & 1) * auVar95._4_4_);
                            auVar86._4_4_ = fVar129;
                            auVar86._0_4_ = fVar136;
                            fVar128 = (float)((uint)((byte)(uVar72 >> 2) & 1) * auVar95._8_4_);
                            auVar86._8_4_ = fVar128;
                            fVar132 = (float)((uint)((byte)(uVar72 >> 3) & 1) * auVar95._12_4_);
                            auVar86._12_4_ = fVar132;
                            fVar133 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar95._16_4_);
                            fVar134 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar95._20_4_);
                            fVar135 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar95._24_4_);
                            in_ZMM14 = ZEXT3264(CONCAT428((uint)(byte)(uVar72 >> 7) * auVar95._28_4_
                                                          ,CONCAT424(fVar135,CONCAT420(fVar134,
                                                  CONCAT416(fVar133,auVar86)))));
                            auVar131._0_4_ = fVar136 * auVar88._0_4_;
                            auVar131._4_4_ = fVar129 * auVar88._4_4_;
                            auVar131._8_4_ = fVar128 * auVar88._8_4_;
                            auVar131._12_4_ = fVar132 * auVar88._12_4_;
                            auVar131._16_4_ = fVar133 * 0.0;
                            auVar131._20_4_ = fVar134 * 0.0;
                            auVar131._24_4_ = fVar135 * 0.0;
                            auVar131._28_4_ = 0;
                            local_5b80 = vminps_avx512vl(auVar131,auVar92);
                            auVar58._4_4_ = fVar129 * auVar84._4_4_;
                            auVar58._0_4_ = fVar136 * auVar84._0_4_;
                            auVar58._8_4_ = fVar128 * auVar84._8_4_;
                            auVar58._12_4_ = fVar132 * auVar84._12_4_;
                            auVar58._16_4_ = fVar133 * 0.0;
                            auVar58._20_4_ = fVar134 * 0.0;
                            auVar58._24_4_ = fVar135 * 0.0;
                            auVar58._28_4_ = auVar94._28_4_;
                            local_5b60 = vminps_avx512vl(auVar58,auVar92);
                            auVar154 = ZEXT3264(local_5b60);
                            pRVar8 = context->user;
                            local_5b20 = vpbroadcastd_avx512vl();
                            auVar163 = ZEXT3264(local_5b20);
                            local_5b40 = vpbroadcastd_avx512vl();
                            auVar172 = ZEXT3264(local_5b40);
                            local_5be0[0] = (RTCHitN)(char)auVar85._0_4_;
                            local_5be0[1] = (RTCHitN)SUB41(auVar85._0_4_,1);
                            local_5be0[2] = (RTCHitN)SUB41(auVar85._0_4_,2);
                            local_5be0[3] = (RTCHitN)SUB41(auVar85._0_4_,3);
                            local_5be0[4] = (RTCHitN)(char)auVar85._4_4_;
                            local_5be0[5] = (RTCHitN)SUB41(auVar85._4_4_,1);
                            local_5be0[6] = (RTCHitN)SUB41(auVar85._4_4_,2);
                            local_5be0[7] = (RTCHitN)SUB41(auVar85._4_4_,3);
                            local_5be0[8] = (RTCHitN)(char)auVar85._8_4_;
                            local_5be0[9] = (RTCHitN)SUB41(auVar85._8_4_,1);
                            local_5be0[10] = (RTCHitN)SUB41(auVar85._8_4_,2);
                            local_5be0[0xb] = (RTCHitN)SUB41(auVar85._8_4_,3);
                            local_5be0[0xc] = (RTCHitN)(char)auVar85._12_4_;
                            local_5be0[0xd] = (RTCHitN)SUB41(auVar85._12_4_,1);
                            local_5be0[0xe] = (RTCHitN)SUB41(auVar85._12_4_,2);
                            local_5be0[0xf] = (RTCHitN)SUB41(auVar85._12_4_,3);
                            local_5be0[0x10] = (RTCHitN)(char)auVar114._16_4_;
                            local_5be0[0x11] = (RTCHitN)(char)(auVar114._16_4_ >> 8);
                            local_5be0[0x12] = (RTCHitN)(char)(auVar114._16_4_ >> 0x10);
                            local_5be0[0x13] = (RTCHitN)(char)(auVar114._16_4_ >> 0x18);
                            local_5be0[0x14] = (RTCHitN)(char)auVar114._20_4_;
                            local_5be0[0x15] = (RTCHitN)(char)(auVar114._20_4_ >> 8);
                            local_5be0[0x16] = (RTCHitN)(char)(auVar114._20_4_ >> 0x10);
                            local_5be0[0x17] = (RTCHitN)(char)(auVar114._20_4_ >> 0x18);
                            local_5be0[0x18] = (RTCHitN)(char)auVar114._24_4_;
                            local_5be0[0x19] = (RTCHitN)(char)(auVar114._24_4_ >> 8);
                            local_5be0[0x1a] = (RTCHitN)(char)(auVar114._24_4_ >> 0x10);
                            local_5be0[0x1b] = (RTCHitN)(char)(auVar114._24_4_ >> 0x18);
                            local_5be0[0x1c] = (RTCHitN)(char)auVar114._28_4_;
                            local_5be0[0x1d] = (RTCHitN)(char)(auVar114._28_4_ >> 8);
                            local_5be0[0x1e] = (RTCHitN)(char)(auVar114._28_4_ >> 0x10);
                            local_5be0[0x1f] = (RTCHitN)(char)(auVar114._28_4_ >> 0x18);
                            _local_5bc0 = auVar115;
                            _local_5ba0 = auVar116;
                            auVar92 = vpcmpeqd_avx2(local_5b80,local_5b80);
                            local_5c88[1] = auVar92;
                            *local_5c88 = auVar92;
                            local_5b00 = pRVar8->instID[0];
                            uStack_5afc = local_5b00;
                            uStack_5af8 = local_5b00;
                            uStack_5af4 = local_5b00;
                            uStack_5af0 = local_5b00;
                            uStack_5aec = local_5b00;
                            uStack_5ae8 = local_5b00;
                            uStack_5ae4 = local_5b00;
                            local_5ae0 = pRVar8->instPrimID[0];
                            uStack_5adc = local_5ae0;
                            uStack_5ad8 = local_5ae0;
                            uStack_5ad4 = local_5ae0;
                            uStack_5ad0 = local_5ae0;
                            uStack_5acc = local_5ae0;
                            uStack_5ac8 = local_5ae0;
                            uStack_5ac4 = local_5ae0;
                            auVar91 = vblendmps_avx512vl(auVar89,auVar91);
                            bVar81 = (bool)(bVar74 >> 1 & 1);
                            bVar10 = (bool)(bVar74 >> 2 & 1);
                            bVar11 = (bool)(bVar74 >> 3 & 1);
                            bVar12 = (bool)(bVar74 >> 4 & 1);
                            bVar13 = (bool)(bVar74 >> 5 & 1);
                            bVar14 = (bool)(bVar74 >> 6 & 1);
                            *(uint *)(ray + 0x100) =
                                 (uint)(bVar74 & 1) * auVar91._0_4_ |
                                 !(bool)(bVar74 & 1) * local_5ae0;
                            *(uint *)(ray + 0x104) =
                                 (uint)bVar81 * auVar91._4_4_ | !bVar81 * local_5ae0;
                            *(uint *)(ray + 0x108) =
                                 (uint)bVar10 * auVar91._8_4_ | !bVar10 * local_5ae0;
                            *(uint *)(ray + 0x10c) =
                                 (uint)bVar11 * auVar91._12_4_ | !bVar11 * local_5ae0;
                            *(uint *)(ray + 0x110) =
                                 (uint)bVar12 * auVar91._16_4_ | !bVar12 * local_5ae0;
                            *(uint *)(ray + 0x114) =
                                 (uint)bVar13 * auVar91._20_4_ | !bVar13 * local_5ae0;
                            *(uint *)(ray + 0x118) =
                                 (uint)bVar14 * auVar91._24_4_ | !bVar14 * local_5ae0;
                            *(uint *)(ray + 0x11c) =
                                 (uint)(bVar74 >> 7) * auVar91._28_4_ |
                                 !(bool)(bVar74 >> 7) * local_5ae0;
                            local_5d20 = vpmovm2d_avx512vl((ulong)bVar74);
                            local_5d00._0_8_ = local_5d20;
                            local_5d00._8_8_ = pGVar5->userPtr;
                            local_5d00._16_8_ = context->user;
                            local_5d00._24_8_ = ray;
                            local_5ce0._0_4_ = SUB84(local_5be0,0);
                            local_5ce0._4_4_ = (float)((ulong)local_5be0 >> 0x20);
                            fStack_5cd8 = 1.12104e-44;
                            local_5ac0 = auVar89;
                            local_5ce0 = local_5be0;
                            if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar154 = ZEXT1664(local_5b60._0_16_);
                              auVar163 = ZEXT1664(local_5b20._0_16_);
                              auVar172 = ZEXT1664(local_5b40._0_16_);
                              in_ZMM7 = ZEXT1664(auVar85);
                              in_ZMM8 = ZEXT1664(auVar93._0_16_);
                              in_ZMM9 = ZEXT1664(auVar138);
                              in_ZMM14 = ZEXT1664(auVar86);
                              in_ZMM15 = ZEXT1664(auVar90._0_16_);
                              (*pGVar5->occlusionFilterN)((RTCFilterFunctionNArguments *)local_5d00)
                              ;
                              in_ZMM13 = ZEXT3264(local_5c00);
                              in_ZMM12 = ZEXT3264(local_5c60);
                              in_ZMM11 = ZEXT3264(local_5c80);
                              auVar89 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar223 = ZEXT3264(auVar89);
                              auVar89 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                              auVar224 = ZEXT3264(auVar89);
                              auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                              auVar229 = ZEXT3264(auVar89);
                              auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                              auVar228 = ZEXT3264(auVar89);
                              auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                              auVar227 = ZEXT3264(auVar89);
                              auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar226 = ZEXT3264(auVar89);
                              auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar225 = ZEXT3264(auVar89);
                            }
                            if (local_5d20 == (undefined1  [32])0x0) {
                              uVar72 = 0;
                            }
                            else {
                              p_Var9 = context->args->filter;
                              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar154 = ZEXT1664(auVar154._0_16_);
                                auVar163 = ZEXT1664(auVar163._0_16_);
                                auVar172 = ZEXT1664(auVar172._0_16_);
                                in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                                in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                (*p_Var9)((RTCFilterFunctionNArguments *)local_5d00);
                                in_ZMM13 = ZEXT3264(local_5c00);
                                in_ZMM12 = ZEXT3264(local_5c60);
                                in_ZMM11 = ZEXT3264(local_5c80);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar223 = ZEXT3264(auVar89);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                auVar224 = ZEXT3264(auVar89);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                auVar229 = ZEXT3264(auVar89);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                auVar228 = ZEXT3264(auVar89);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar227 = ZEXT3264(auVar89);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar226 = ZEXT3264(auVar89);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar225 = ZEXT3264(auVar89);
                              }
                              uVar72 = vptestmd_avx512vl(local_5d20,local_5d20);
                              auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              bVar81 = (bool)((byte)uVar72 & 1);
                              auVar124._0_4_ =
                                   (uint)bVar81 * auVar89._0_4_ |
                                   (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x100);
                              bVar81 = (bool)((byte)(uVar72 >> 1) & 1);
                              auVar124._4_4_ =
                                   (uint)bVar81 * auVar89._4_4_ |
                                   (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x104);
                              bVar81 = (bool)((byte)(uVar72 >> 2) & 1);
                              auVar124._8_4_ =
                                   (uint)bVar81 * auVar89._8_4_ |
                                   (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x108);
                              bVar81 = (bool)((byte)(uVar72 >> 3) & 1);
                              auVar124._12_4_ =
                                   (uint)bVar81 * auVar89._12_4_ |
                                   (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x10c);
                              bVar81 = (bool)((byte)(uVar72 >> 4) & 1);
                              auVar124._16_4_ =
                                   (uint)bVar81 * auVar89._16_4_ |
                                   (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x110);
                              bVar81 = (bool)((byte)(uVar72 >> 5) & 1);
                              auVar124._20_4_ =
                                   (uint)bVar81 * auVar89._20_4_ |
                                   (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x114);
                              bVar81 = (bool)((byte)(uVar72 >> 6) & 1);
                              auVar124._24_4_ =
                                   (uint)bVar81 * auVar89._24_4_ |
                                   (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x118);
                              bVar81 = SUB81(uVar72 >> 7,0);
                              auVar124._28_4_ =
                                   (uint)bVar81 * auVar89._28_4_ |
                                   (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x11c);
                              *(undefined1 (*) [32])(local_5d00._24_8_ + 0x100) = auVar124;
                            }
                            bVar74 = (byte)uVar72;
                            auVar126._0_4_ =
                                 (uint)(bVar74 & 1) * *(int *)local_5d30 |
                                 (uint)!(bool)(bVar74 & 1) * local_5ac0._0_4_;
                            bVar81 = (bool)((byte)(uVar72 >> 1) & 1);
                            auVar126._4_4_ =
                                 (uint)bVar81 * *(int *)(local_5d30 + 4) |
                                 (uint)!bVar81 * local_5ac0._4_4_;
                            bVar81 = (bool)((byte)(uVar72 >> 2) & 1);
                            auVar126._8_4_ =
                                 (uint)bVar81 * *(int *)(local_5d30 + 8) |
                                 (uint)!bVar81 * local_5ac0._8_4_;
                            bVar81 = (bool)((byte)(uVar72 >> 3) & 1);
                            auVar126._12_4_ =
                                 (uint)bVar81 * *(int *)(local_5d30 + 0xc) |
                                 (uint)!bVar81 * local_5ac0._12_4_;
                            bVar81 = (bool)((byte)(uVar72 >> 4) & 1);
                            auVar126._16_4_ =
                                 (uint)bVar81 * *(int *)(local_5d30 + 0x10) |
                                 (uint)!bVar81 * local_5ac0._16_4_;
                            bVar81 = (bool)((byte)(uVar72 >> 5) & 1);
                            auVar126._20_4_ =
                                 (uint)bVar81 * *(int *)(local_5d30 + 0x14) |
                                 (uint)!bVar81 * local_5ac0._20_4_;
                            bVar81 = (bool)((byte)(uVar72 >> 6) & 1);
                            auVar126._24_4_ =
                                 (uint)bVar81 * *(int *)(local_5d30 + 0x18) |
                                 (uint)!bVar81 * local_5ac0._24_4_;
                            bVar81 = (bool)((byte)(uVar72 >> 7) & 1);
                            auVar126._28_4_ =
                                 (uint)bVar81 * *(int *)(local_5d30 + 0x1c) |
                                 (uint)!bVar81 * local_5ac0._28_4_;
                            in_ZMM10 = ZEXT3264(auVar126);
                            *(undefined1 (*) [32])local_5d30 = auVar126;
                          }
                          bVar77 = bVar77 & ~bVar74;
                        }
                      }
                      if (bVar77 == 0) {
                        bVar77 = 0;
                        break;
                      }
                      auVar89 = *(undefined1 (*) [32])ray;
                      auVar90 = *(undefined1 (*) [32])(ray + 0x20);
                      auVar91 = *(undefined1 (*) [32])(ray + 0x40);
                      auVar92 = *(undefined1 (*) [32])(ray + 0x80);
                      in_ZMM7 = ZEXT3264(auVar92);
                      auVar93 = *(undefined1 (*) [32])(ray + 0xa0);
                      in_ZMM8 = ZEXT3264(auVar93);
                      auVar94 = *(undefined1 (*) [32])(ray + 0xc0);
                      in_ZMM10 = ZEXT3264(auVar94);
                      auVar95 = vsubps_avx(_local_5a60,auVar89);
                      auVar163 = ZEXT3264(auVar95);
                      auVar96 = vsubps_avx(local_5a80,auVar90);
                      auVar172 = ZEXT3264(auVar96);
                      auVar117 = vsubps_avx(local_5aa0,auVar91);
                      in_ZMM9 = ZEXT3264(auVar117);
                      auVar120 = vsubps_avx(in_ZMM11._0_32_,auVar89);
                      auVar111 = vsubps_avx(in_ZMM12._0_32_,auVar90);
                      auVar112 = vsubps_avx512vl(in_ZMM13._0_32_,auVar91);
                      auVar89 = vsubps_avx512vl(local_5840,auVar89);
                      auVar90 = vsubps_avx512vl(local_5860,auVar90);
                      auVar91 = vsubps_avx512vl(local_5880,auVar91);
                      auVar100 = vsubps_avx512vl(auVar89,auVar95);
                      in_ZMM12 = ZEXT3264(auVar100);
                      auVar101 = vsubps_avx512vl(auVar90,auVar96);
                      in_ZMM14 = ZEXT3264(auVar101);
                      auVar102 = vsubps_avx512vl(auVar91,auVar117);
                      in_ZMM13 = ZEXT3264(auVar102);
                      auVar103 = vsubps_avx512vl(auVar95,auVar120);
                      auVar104 = vsubps_avx512vl(auVar96,auVar111);
                      auVar105 = vsubps_avx512vl(auVar117,auVar112);
                      auVar106 = vsubps_avx512vl(auVar120,auVar89);
                      auVar107 = vsubps_avx512vl(auVar111,auVar90);
                      auVar108 = vsubps_avx512vl(auVar112,auVar91);
                      auVar109 = vaddps_avx512vl(auVar89,auVar95);
                      auVar110 = vaddps_avx512vl(auVar90,auVar96);
                      auVar113 = vaddps_avx512vl(auVar91,auVar117);
                      auVar118 = vmulps_avx512vl(auVar110,auVar102);
                      auVar118 = vfmsub231ps_avx512vl(auVar118,auVar101,auVar113);
                      auVar113 = vmulps_avx512vl(auVar113,auVar100);
                      auVar113 = vfmsub231ps_avx512vl(auVar113,auVar102,auVar109);
                      auVar54._4_4_ = auVar101._4_4_ * auVar109._4_4_;
                      auVar54._0_4_ = auVar101._0_4_ * auVar109._0_4_;
                      auVar54._8_4_ = auVar101._8_4_ * auVar109._8_4_;
                      auVar54._12_4_ = auVar101._12_4_ * auVar109._12_4_;
                      auVar54._16_4_ = auVar101._16_4_ * auVar109._16_4_;
                      auVar54._20_4_ = auVar101._20_4_ * auVar109._20_4_;
                      auVar54._24_4_ = auVar101._24_4_ * auVar109._24_4_;
                      auVar54._28_4_ = auVar109._28_4_;
                      auVar88 = vfmsub231ps_fma(auVar54,auVar100,auVar110);
                      fVar129 = auVar94._0_4_;
                      auVar149._0_4_ = fVar129 * auVar88._0_4_;
                      fVar128 = auVar94._4_4_;
                      auVar149._4_4_ = fVar128 * auVar88._4_4_;
                      fVar132 = auVar94._8_4_;
                      auVar149._8_4_ = fVar132 * auVar88._8_4_;
                      fVar133 = auVar94._12_4_;
                      auVar149._12_4_ = fVar133 * auVar88._12_4_;
                      fVar134 = auVar94._16_4_;
                      auVar149._16_4_ = fVar134 * 0.0;
                      fVar135 = auVar94._20_4_;
                      auVar149._20_4_ = fVar135 * 0.0;
                      fVar136 = auVar94._24_4_;
                      auVar149._24_4_ = fVar136 * 0.0;
                      auVar149._28_4_ = 0;
                      auVar109 = vfmadd231ps_avx512vl(auVar149,auVar93,auVar113);
                      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar92,auVar118);
                      auVar153._0_4_ = auVar120._0_4_ + auVar95._0_4_;
                      auVar153._4_4_ = auVar120._4_4_ + auVar95._4_4_;
                      auVar153._8_4_ = auVar120._8_4_ + auVar95._8_4_;
                      auVar153._12_4_ = auVar120._12_4_ + auVar95._12_4_;
                      auVar153._16_4_ = auVar120._16_4_ + auVar95._16_4_;
                      auVar153._20_4_ = auVar120._20_4_ + auVar95._20_4_;
                      auVar153._24_4_ = auVar120._24_4_ + auVar95._24_4_;
                      auVar153._28_4_ = auVar120._28_4_ + auVar95._28_4_;
                      auVar110 = vaddps_avx512vl(auVar96,auVar111);
                      auVar113 = vaddps_avx512vl(auVar117,auVar112);
                      auVar118 = vmulps_avx512vl(auVar110,auVar105);
                      auVar118 = vfmsub231ps_avx512vl(auVar118,auVar104,auVar113);
                      auVar113 = vmulps_avx512vl(auVar113,auVar103);
                      auVar113 = vfmsub231ps_avx512vl(auVar113,auVar105,auVar153);
                      auVar119 = vmulps_avx512vl(auVar153,auVar104);
                      auVar110 = vfmsub231ps_avx512vl(auVar119,auVar103,auVar110);
                      auVar55._4_4_ = fVar128 * auVar110._4_4_;
                      auVar55._0_4_ = fVar129 * auVar110._0_4_;
                      auVar55._8_4_ = fVar132 * auVar110._8_4_;
                      auVar55._12_4_ = fVar133 * auVar110._12_4_;
                      auVar55._16_4_ = fVar134 * auVar110._16_4_;
                      auVar55._20_4_ = fVar135 * auVar110._20_4_;
                      auVar55._24_4_ = fVar136 * auVar110._24_4_;
                      auVar55._28_4_ = auVar110._28_4_;
                      auVar110 = vfmadd231ps_avx512vl(auVar55,auVar93,auVar113);
                      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar223 = ZEXT3264(auVar113);
                      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar92,auVar118);
                      auVar154 = ZEXT3264(auVar110);
                      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                      auVar224 = ZEXT3264(auVar118);
                      auVar89 = vaddps_avx512vl(auVar120,auVar89);
                      auVar90 = vaddps_avx512vl(auVar111,auVar90);
                      auVar91 = vaddps_avx512vl(auVar112,auVar91);
                      auVar120 = vmulps_avx512vl(auVar90,auVar108);
                      auVar120 = vfmsub231ps_avx512vl(auVar120,auVar107,auVar91);
                      auVar91 = vmulps_avx512vl(auVar91,auVar106);
                      auVar91 = vfmsub231ps_avx512vl(auVar91,auVar108,auVar89);
                      auVar56._4_4_ = auVar89._4_4_ * auVar107._4_4_;
                      auVar56._0_4_ = auVar89._0_4_ * auVar107._0_4_;
                      auVar56._8_4_ = auVar89._8_4_ * auVar107._8_4_;
                      auVar56._12_4_ = auVar89._12_4_ * auVar107._12_4_;
                      auVar56._16_4_ = auVar89._16_4_ * auVar107._16_4_;
                      auVar56._20_4_ = auVar89._20_4_ * auVar107._20_4_;
                      auVar56._24_4_ = auVar89._24_4_ * auVar107._24_4_;
                      auVar56._28_4_ = auVar89._28_4_;
                      auVar88 = vfmsub231ps_fma(auVar56,auVar106,auVar90);
                      auVar89 = vmulps_avx512vl(ZEXT1632(auVar88),auVar94);
                      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar93,auVar91);
                      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar92,auVar120);
                      in_ZMM21 = ZEXT3264(auVar89);
                      auVar198._0_4_ = auVar109._0_4_ + auVar110._0_4_;
                      auVar198._4_4_ = auVar109._4_4_ + auVar110._4_4_;
                      auVar198._8_4_ = auVar109._8_4_ + auVar110._8_4_;
                      auVar198._12_4_ = auVar109._12_4_ + auVar110._12_4_;
                      auVar198._16_4_ = auVar109._16_4_ + auVar110._16_4_;
                      auVar198._20_4_ = auVar109._20_4_ + auVar110._20_4_;
                      auVar198._24_4_ = auVar109._24_4_ + auVar110._24_4_;
                      auVar198._28_4_ = auVar109._28_4_ + auVar110._28_4_;
                      auVar90 = vaddps_avx512vl(auVar89,auVar198);
                      in_ZMM11 = ZEXT3264(auVar90);
                      auVar112 = auVar225._0_32_;
                      vandps_avx512vl(auVar90,auVar112);
                      in_ZMM15 = ZEXT3264(auVar90);
                      auVar91 = vmulps_avx512vl(auVar90,auVar118);
                      auVar120 = vminps_avx512vl(auVar109,auVar110);
                      auVar120 = vminps_avx512vl(auVar120,auVar89);
                      auVar111 = vxorps_avx512vl(auVar91,auVar113);
                      uVar19 = vcmpps_avx512vl(auVar120,auVar111,5);
                      auVar120 = vmaxps_avx512vl(auVar109,auVar110);
                      auVar89 = vmaxps_avx512vl(auVar120,auVar89);
                      in_ZMM20 = ZEXT3264(auVar89);
                      uVar20 = vcmpps_avx512vl(auVar89,auVar91,2);
                      bVar74 = ((byte)uVar19 | (byte)uVar20) & bVar77;
                      if (bVar74 != 0) {
                        auVar89 = vmulps_avx512vl(auVar104,auVar102);
                        auVar91 = vmulps_avx512vl(auVar100,auVar105);
                        in_ZMM20 = ZEXT3264(auVar91);
                        auVar120 = vmulps_avx512vl(auVar103,auVar101);
                        in_ZMM21 = ZEXT3264(auVar120);
                        auVar111 = vmulps_avx512vl(auVar107,auVar105);
                        auVar113 = vmulps_avx512vl(auVar103,auVar108);
                        auVar118 = vmulps_avx512vl(auVar106,auVar104);
                        auVar101 = vfmsub213ps_avx512vl(auVar101,auVar105,auVar89);
                        in_ZMM14 = ZEXT3264(auVar101);
                        auVar102 = vfmsub213ps_avx512vl(auVar102,auVar103,auVar91);
                        in_ZMM13 = ZEXT3264(auVar102);
                        auVar100 = vfmsub213ps_avx512vl(auVar100,auVar104,auVar120);
                        in_ZMM12 = ZEXT3264(auVar100);
                        auVar104 = vfmsub213ps_avx512vl(auVar108,auVar104,auVar111);
                        auVar105 = vfmsub213ps_avx512vl(auVar106,auVar105,auVar113);
                        auVar103 = vfmsub213ps_avx512vl(auVar107,auVar103,auVar118);
                        vandps_avx512vl(auVar89,auVar112);
                        vandps_avx512vl(auVar111,auVar112);
                        uVar72 = vcmpps_avx512vl(auVar103,auVar103,1);
                        vandps_avx512vl(auVar91,auVar112);
                        vandps_avx512vl(auVar113,auVar112);
                        uVar78 = vcmpps_avx512vl(auVar103,auVar103,1);
                        vandps_avx512vl(auVar120,auVar112);
                        vandps_avx512vl(auVar118,auVar112);
                        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar223 = ZEXT3264(auVar89);
                        uVar83 = vcmpps_avx512vl(auVar103,auVar103,1);
                        bVar81 = (bool)((byte)uVar72 & 1);
                        auVar121._0_4_ =
                             (uint)bVar81 * auVar101._0_4_ | (uint)!bVar81 * auVar104._0_4_;
                        bVar81 = (bool)((byte)(uVar72 >> 1) & 1);
                        auVar121._4_4_ =
                             (uint)bVar81 * auVar101._4_4_ | (uint)!bVar81 * auVar104._4_4_;
                        bVar81 = (bool)((byte)(uVar72 >> 2) & 1);
                        auVar121._8_4_ =
                             (uint)bVar81 * auVar101._8_4_ | (uint)!bVar81 * auVar104._8_4_;
                        bVar81 = (bool)((byte)(uVar72 >> 3) & 1);
                        auVar121._12_4_ =
                             (uint)bVar81 * auVar101._12_4_ | (uint)!bVar81 * auVar104._12_4_;
                        bVar81 = (bool)((byte)(uVar72 >> 4) & 1);
                        auVar121._16_4_ =
                             (uint)bVar81 * auVar101._16_4_ | (uint)!bVar81 * auVar104._16_4_;
                        bVar81 = (bool)((byte)(uVar72 >> 5) & 1);
                        auVar121._20_4_ =
                             (uint)bVar81 * auVar101._20_4_ | (uint)!bVar81 * auVar104._20_4_;
                        bVar81 = (bool)((byte)(uVar72 >> 6) & 1);
                        auVar121._24_4_ =
                             (uint)bVar81 * auVar101._24_4_ | (uint)!bVar81 * auVar104._24_4_;
                        bVar81 = SUB81(uVar72 >> 7,0);
                        auVar121._28_4_ =
                             (uint)bVar81 * auVar101._28_4_ | (uint)!bVar81 * auVar104._28_4_;
                        bVar81 = (bool)((byte)uVar78 & 1);
                        auVar122._0_4_ =
                             (uint)bVar81 * auVar102._0_4_ | (uint)!bVar81 * auVar105._0_4_;
                        bVar81 = (bool)((byte)(uVar78 >> 1) & 1);
                        auVar122._4_4_ =
                             (uint)bVar81 * auVar102._4_4_ | (uint)!bVar81 * auVar105._4_4_;
                        bVar81 = (bool)((byte)(uVar78 >> 2) & 1);
                        auVar122._8_4_ =
                             (uint)bVar81 * auVar102._8_4_ | (uint)!bVar81 * auVar105._8_4_;
                        bVar81 = (bool)((byte)(uVar78 >> 3) & 1);
                        auVar122._12_4_ =
                             (uint)bVar81 * auVar102._12_4_ | (uint)!bVar81 * auVar105._12_4_;
                        bVar81 = (bool)((byte)(uVar78 >> 4) & 1);
                        auVar122._16_4_ =
                             (uint)bVar81 * auVar102._16_4_ | (uint)!bVar81 * auVar105._16_4_;
                        bVar81 = (bool)((byte)(uVar78 >> 5) & 1);
                        auVar122._20_4_ =
                             (uint)bVar81 * auVar102._20_4_ | (uint)!bVar81 * auVar105._20_4_;
                        bVar81 = (bool)((byte)(uVar78 >> 6) & 1);
                        auVar122._24_4_ =
                             (uint)bVar81 * auVar102._24_4_ | (uint)!bVar81 * auVar105._24_4_;
                        bVar81 = SUB81(uVar78 >> 7,0);
                        auVar122._28_4_ =
                             (uint)bVar81 * auVar102._28_4_ | (uint)!bVar81 * auVar105._28_4_;
                        bVar81 = (bool)((byte)uVar83 & 1);
                        auVar123._0_4_ =
                             (float)((uint)bVar81 * auVar100._0_4_ | (uint)!bVar81 * auVar103._0_4_)
                        ;
                        bVar81 = (bool)((byte)(uVar83 >> 1) & 1);
                        auVar123._4_4_ =
                             (float)((uint)bVar81 * auVar100._4_4_ | (uint)!bVar81 * auVar103._4_4_)
                        ;
                        bVar81 = (bool)((byte)(uVar83 >> 2) & 1);
                        auVar123._8_4_ =
                             (float)((uint)bVar81 * auVar100._8_4_ | (uint)!bVar81 * auVar103._8_4_)
                        ;
                        bVar81 = (bool)((byte)(uVar83 >> 3) & 1);
                        auVar123._12_4_ =
                             (float)((uint)bVar81 * auVar100._12_4_ |
                                    (uint)!bVar81 * auVar103._12_4_);
                        bVar81 = (bool)((byte)(uVar83 >> 4) & 1);
                        auVar123._16_4_ =
                             (float)((uint)bVar81 * auVar100._16_4_ |
                                    (uint)!bVar81 * auVar103._16_4_);
                        bVar81 = (bool)((byte)(uVar83 >> 5) & 1);
                        auVar123._20_4_ =
                             (float)((uint)bVar81 * auVar100._20_4_ |
                                    (uint)!bVar81 * auVar103._20_4_);
                        bVar81 = (bool)((byte)(uVar83 >> 6) & 1);
                        auVar123._24_4_ =
                             (float)((uint)bVar81 * auVar100._24_4_ |
                                    (uint)!bVar81 * auVar103._24_4_);
                        bVar81 = SUB81(uVar83 >> 7,0);
                        auVar123._28_4_ =
                             (uint)bVar81 * auVar100._28_4_ | (uint)!bVar81 * auVar103._28_4_;
                        auVar57._4_4_ = fVar128 * auVar123._4_4_;
                        auVar57._0_4_ = fVar129 * auVar123._0_4_;
                        auVar57._8_4_ = fVar132 * auVar123._8_4_;
                        auVar57._12_4_ = fVar133 * auVar123._12_4_;
                        auVar57._16_4_ = fVar134 * auVar123._16_4_;
                        auVar57._20_4_ = fVar135 * auVar123._20_4_;
                        auVar57._24_4_ = fVar136 * auVar123._24_4_;
                        auVar57._28_4_ = auVar94._28_4_;
                        auVar88 = vfmadd213ps_fma(auVar93,auVar122,auVar57);
                        auVar88 = vfmadd213ps_fma(auVar92,auVar121,ZEXT1632(auVar88));
                        auVar93 = ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                     CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                              CONCAT44(auVar88._4_4_ + auVar88._4_4_
                                                                       ,auVar88._0_4_ +
                                                                        auVar88._0_4_))));
                        in_ZMM7 = ZEXT3264(auVar93);
                        auVar188._0_4_ = auVar117._0_4_ * auVar123._0_4_;
                        auVar188._4_4_ = auVar117._4_4_ * auVar123._4_4_;
                        auVar188._8_4_ = auVar117._8_4_ * auVar123._8_4_;
                        auVar188._12_4_ = auVar117._12_4_ * auVar123._12_4_;
                        auVar188._16_4_ = auVar117._16_4_ * auVar123._16_4_;
                        auVar188._20_4_ = auVar117._20_4_ * auVar123._20_4_;
                        auVar188._24_4_ = auVar117._24_4_ * auVar123._24_4_;
                        auVar188._28_4_ = 0;
                        auVar88 = vfmadd213ps_fma(auVar96,auVar122,auVar188);
                        auVar84 = vfmadd213ps_fma(auVar95,auVar121,ZEXT1632(auVar88));
                        auVar91 = vrcp14ps_avx512vl(auVar93);
                        auVar172 = ZEXT3264(auVar91);
                        auVar92 = vxorps_avx512vl(auVar93,auVar89);
                        in_ZMM8 = ZEXT3264(auVar92);
                        auVar94 = auVar226._0_32_;
                        auVar89 = vfnmadd213ps_avx512vl(auVar91,auVar93,auVar94);
                        auVar88 = vfmadd132ps_fma(auVar89,auVar91,auVar91);
                        in_ZMM9 = ZEXT1664(auVar88);
                        local_5c80 = *(undefined1 (*) [32])(ray + 0x100);
                        in_ZMM10 = ZEXT3264(local_5c80);
                        auVar162._0_4_ = auVar88._0_4_ * (auVar84._0_4_ + auVar84._0_4_);
                        auVar162._4_4_ = auVar88._4_4_ * (auVar84._4_4_ + auVar84._4_4_);
                        auVar162._8_4_ = auVar88._8_4_ * (auVar84._8_4_ + auVar84._8_4_);
                        auVar162._12_4_ = auVar88._12_4_ * (auVar84._12_4_ + auVar84._12_4_);
                        auVar89 = ZEXT1632(auVar162);
                        auVar163 = ZEXT3264(auVar89);
                        uVar19 = vcmpps_avx512vl(auVar89,local_5c80,2);
                        uVar20 = vcmpps_avx512vl(auVar89,*(undefined1 (*) [32])(ray + 0x60),0xd);
                        uVar21 = vcmpps_avx512vl(auVar93,auVar92,4);
                        bVar74 = bVar74 & (byte)uVar19 & (byte)uVar20 & (byte)uVar21;
                        if (bVar74 != 0) {
                          pGVar5 = (context->scene->geometries).items
                                   [*(uint *)(lVar75 + 0x40 + uVar73 * 4)].ptr;
                          uVar2 = pGVar5->mask;
                          auVar171._4_4_ = uVar2;
                          auVar171._0_4_ = uVar2;
                          auVar171._8_4_ = uVar2;
                          auVar171._12_4_ = uVar2;
                          auVar171._16_4_ = uVar2;
                          auVar171._20_4_ = uVar2;
                          auVar171._24_4_ = uVar2;
                          auVar171._28_4_ = uVar2;
                          auVar172 = ZEXT3264(auVar171);
                          uVar19 = vptestmd_avx512vl(auVar171,*(undefined1 (*) [32])(ray + 0x120));
                          bVar74 = bVar74 & (byte)uVar19;
                          if (bVar74 != 0) {
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar46._8_4_ = 0x219392ef;
                              auVar46._0_8_ = 0x219392ef219392ef;
                              auVar46._12_4_ = 0x219392ef;
                              auVar46._16_4_ = 0x219392ef;
                              auVar46._20_4_ = 0x219392ef;
                              auVar46._24_4_ = 0x219392ef;
                              auVar46._28_4_ = 0x219392ef;
                              uVar72 = vcmpps_avx512vl(auVar90,auVar46,5);
                              auVar91 = vrcp14ps_avx512vl(auVar90);
                              auVar93 = vfnmadd213ps_avx512vl(auVar90,auVar91,auVar94);
                              auVar91 = vfmadd132ps_avx512vl(auVar93,auVar91,auVar91);
                              fVar136 = (float)((uint)((byte)uVar72 & 1) * auVar91._0_4_);
                              fVar135 = (float)((uint)((byte)(uVar72 >> 1) & 1) * auVar91._4_4_);
                              auVar87._4_4_ = fVar135;
                              auVar87._0_4_ = fVar136;
                              fVar134 = (float)((uint)((byte)(uVar72 >> 2) & 1) * auVar91._8_4_);
                              auVar87._8_4_ = fVar134;
                              fVar133 = (float)((uint)((byte)(uVar72 >> 3) & 1) * auVar91._12_4_);
                              auVar87._12_4_ = fVar133;
                              fVar132 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar91._16_4_);
                              fVar128 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar91._20_4_);
                              fVar129 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar91._24_4_);
                              in_ZMM11 = ZEXT3264(CONCAT428((uint)(byte)(uVar72 >> 7) *
                                                            auVar91._28_4_,
                                                            CONCAT424(fVar129,CONCAT420(fVar128,
                                                  CONCAT416(fVar132,auVar87)))));
                              auVar59._4_4_ = fVar135 * auVar109._4_4_;
                              auVar59._0_4_ = fVar136 * auVar109._0_4_;
                              auVar59._8_4_ = fVar134 * auVar109._8_4_;
                              auVar59._12_4_ = fVar133 * auVar109._12_4_;
                              auVar59._16_4_ = fVar132 * auVar109._16_4_;
                              auVar59._20_4_ = fVar128 * auVar109._20_4_;
                              auVar59._24_4_ = fVar129 * auVar109._24_4_;
                              auVar59._28_4_ = auVar109._28_4_;
                              auVar91 = vminps_avx512vl(auVar59,auVar94);
                              auVar60._4_4_ = fVar135 * auVar110._4_4_;
                              auVar60._0_4_ = fVar136 * auVar110._0_4_;
                              auVar60._8_4_ = fVar134 * auVar110._8_4_;
                              auVar60._12_4_ = fVar133 * auVar110._12_4_;
                              auVar60._16_4_ = fVar132 * auVar110._16_4_;
                              auVar60._20_4_ = fVar128 * auVar110._20_4_;
                              auVar60._24_4_ = fVar129 * auVar110._24_4_;
                              auVar60._28_4_ = auVar110._28_4_;
                              auVar93 = vminps_avx512vl(auVar60,auVar94);
                              local_5b80 = vsubps_avx512vl(auVar94,auVar91);
                              local_5b60 = vsubps_avx512vl(auVar94,auVar93);
                              auVar154 = ZEXT3264(local_5b60);
                              pRVar8 = context->user;
                              local_5b20 = vpbroadcastd_avx512vl();
                              auVar172 = ZEXT3264(local_5b20);
                              local_5b40 = vpbroadcastd_avx512vl();
                              in_ZMM7 = ZEXT3264(local_5b40);
                              local_5be0[0] = (RTCHitN)(char)auVar121._0_4_;
                              local_5be0[1] = (RTCHitN)(char)(auVar121._0_4_ >> 8);
                              local_5be0[2] = (RTCHitN)(char)(auVar121._0_4_ >> 0x10);
                              local_5be0[3] = (RTCHitN)(char)(auVar121._0_4_ >> 0x18);
                              local_5be0[4] = (RTCHitN)(char)auVar121._4_4_;
                              local_5be0[5] = (RTCHitN)(char)(auVar121._4_4_ >> 8);
                              local_5be0[6] = (RTCHitN)(char)(auVar121._4_4_ >> 0x10);
                              local_5be0[7] = (RTCHitN)(char)(auVar121._4_4_ >> 0x18);
                              local_5be0[8] = (RTCHitN)(char)auVar121._8_4_;
                              local_5be0[9] = (RTCHitN)(char)(auVar121._8_4_ >> 8);
                              local_5be0[10] = (RTCHitN)(char)(auVar121._8_4_ >> 0x10);
                              local_5be0[0xb] = (RTCHitN)(char)(auVar121._8_4_ >> 0x18);
                              local_5be0[0xc] = (RTCHitN)(char)auVar121._12_4_;
                              local_5be0[0xd] = (RTCHitN)(char)(auVar121._12_4_ >> 8);
                              local_5be0[0xe] = (RTCHitN)(char)(auVar121._12_4_ >> 0x10);
                              local_5be0[0xf] = (RTCHitN)(char)(auVar121._12_4_ >> 0x18);
                              local_5be0[0x10] = (RTCHitN)(char)auVar121._16_4_;
                              local_5be0[0x11] = (RTCHitN)(char)(auVar121._16_4_ >> 8);
                              local_5be0[0x12] = (RTCHitN)(char)(auVar121._16_4_ >> 0x10);
                              local_5be0[0x13] = (RTCHitN)(char)(auVar121._16_4_ >> 0x18);
                              local_5be0[0x14] = (RTCHitN)(char)auVar121._20_4_;
                              local_5be0[0x15] = (RTCHitN)(char)(auVar121._20_4_ >> 8);
                              local_5be0[0x16] = (RTCHitN)(char)(auVar121._20_4_ >> 0x10);
                              local_5be0[0x17] = (RTCHitN)(char)(auVar121._20_4_ >> 0x18);
                              local_5be0[0x18] = (RTCHitN)(char)auVar121._24_4_;
                              local_5be0[0x19] = (RTCHitN)(char)(auVar121._24_4_ >> 8);
                              local_5be0[0x1a] = (RTCHitN)(char)(auVar121._24_4_ >> 0x10);
                              local_5be0[0x1b] = (RTCHitN)(char)(auVar121._24_4_ >> 0x18);
                              local_5be0[0x1c] = (RTCHitN)(char)auVar121._28_4_;
                              local_5be0[0x1d] = (RTCHitN)(char)(auVar121._28_4_ >> 8);
                              local_5be0[0x1e] = (RTCHitN)(char)(auVar121._28_4_ >> 0x10);
                              local_5be0[0x1f] = (RTCHitN)(char)(auVar121._28_4_ >> 0x18);
                              _local_5bc0 = auVar122;
                              _local_5ba0 = auVar123;
                              auVar91 = vpcmpeqd_avx2(auVar122,auVar122);
                              local_5c88[1] = auVar91;
                              *local_5c88 = auVar91;
                              local_5b00 = pRVar8->instID[0];
                              uStack_5afc = local_5b00;
                              uStack_5af8 = local_5b00;
                              uStack_5af4 = local_5b00;
                              uStack_5af0 = local_5b00;
                              uStack_5aec = local_5b00;
                              uStack_5ae8 = local_5b00;
                              uStack_5ae4 = local_5b00;
                              local_5ae0 = pRVar8->instPrimID[0];
                              uStack_5adc = local_5ae0;
                              uStack_5ad8 = local_5ae0;
                              uStack_5ad4 = local_5ae0;
                              uStack_5ad0 = local_5ae0;
                              uStack_5acc = local_5ae0;
                              uStack_5ac8 = local_5ae0;
                              uStack_5ac4 = local_5ae0;
                              auVar89 = vblendmps_avx512vl(local_5c80,auVar89);
                              bVar81 = (bool)(bVar74 >> 1 & 1);
                              bVar10 = (bool)(bVar74 >> 2 & 1);
                              bVar11 = (bool)(bVar74 >> 3 & 1);
                              bVar12 = (bool)(bVar74 >> 4 & 1);
                              bVar13 = (bool)(bVar74 >> 5 & 1);
                              bVar14 = (bool)(bVar74 >> 6 & 1);
                              *(uint *)(ray + 0x100) =
                                   (uint)(bVar74 & 1) * auVar89._0_4_ |
                                   !(bool)(bVar74 & 1) * local_5ae0;
                              *(uint *)(ray + 0x104) =
                                   (uint)bVar81 * auVar89._4_4_ | !bVar81 * local_5ae0;
                              *(uint *)(ray + 0x108) =
                                   (uint)bVar10 * auVar89._8_4_ | !bVar10 * local_5ae0;
                              *(uint *)(ray + 0x10c) =
                                   (uint)bVar11 * auVar89._12_4_ | !bVar11 * local_5ae0;
                              *(uint *)(ray + 0x110) =
                                   (uint)bVar12 * auVar89._16_4_ | !bVar12 * local_5ae0;
                              *(uint *)(ray + 0x114) =
                                   (uint)bVar13 * auVar89._20_4_ | !bVar13 * local_5ae0;
                              *(uint *)(ray + 0x118) =
                                   (uint)bVar14 * auVar89._24_4_ | !bVar14 * local_5ae0;
                              *(uint *)(ray + 0x11c) =
                                   (uint)(bVar74 >> 7) * auVar89._28_4_ |
                                   !(bool)(bVar74 >> 7) * local_5ae0;
                              local_5d20 = vpmovm2d_avx512vl((ulong)bVar74);
                              local_5d00._0_8_ = local_5d20;
                              local_5d00._8_8_ = pGVar5->userPtr;
                              local_5d00._16_8_ = context->user;
                              local_5d00._24_8_ = ray;
                              local_5ce0._0_4_ = SUB84(local_5be0,0);
                              local_5ce0._4_4_ = (float)((ulong)local_5be0 >> 0x20);
                              fStack_5cd8 = 1.12104e-44;
                              local_5ce0 = local_5be0;
                              if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                auVar154 = ZEXT1664(local_5b60._0_16_);
                                auVar163 = ZEXT1664(auVar162);
                                auVar172 = ZEXT1664(local_5b20._0_16_);
                                in_ZMM7 = ZEXT1664(local_5b40._0_16_);
                                in_ZMM8 = ZEXT1664(auVar92._0_16_);
                                in_ZMM9 = ZEXT1664(auVar88);
                                in_ZMM11 = ZEXT1664(auVar87);
                                in_ZMM12 = ZEXT1664(auVar100._0_16_);
                                in_ZMM13 = ZEXT1664(auVar102._0_16_);
                                in_ZMM14 = ZEXT1664(auVar101._0_16_);
                                in_ZMM15 = ZEXT1664(auVar90._0_16_);
                                (*pGVar5->occlusionFilterN)
                                          ((RTCFilterFunctionNArguments *)local_5d00);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar223 = ZEXT3264(auVar89);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                auVar224 = ZEXT3264(auVar89);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                auVar229 = ZEXT3264(auVar89);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                auVar228 = ZEXT3264(auVar89);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar227 = ZEXT3264(auVar89);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar226 = ZEXT3264(auVar89);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar225 = ZEXT3264(auVar89);
                              }
                              if (local_5d20 == (undefined1  [32])0x0) {
                                uVar72 = 0;
                              }
                              else {
                                p_Var9 = context->args->filter;
                                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar154 = ZEXT1664(auVar154._0_16_);
                                  auVar163 = ZEXT1664(auVar163._0_16_);
                                  auVar172 = ZEXT1664(auVar172._0_16_);
                                  in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                                  in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                                  in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                  in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                                  in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                  in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                  (*p_Var9)((RTCFilterFunctionNArguments *)local_5d00);
                                  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar223 = ZEXT3264(auVar89);
                                  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                  auVar224 = ZEXT3264(auVar89);
                                  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                  auVar229 = ZEXT3264(auVar89);
                                  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                  auVar228 = ZEXT3264(auVar89);
                                  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                  auVar227 = ZEXT3264(auVar89);
                                  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar226 = ZEXT3264(auVar89);
                                  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar225 = ZEXT3264(auVar89);
                                }
                                uVar72 = vptestmd_avx512vl(local_5d20,local_5d20);
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar81 = (bool)((byte)uVar72 & 1);
                                auVar125._0_4_ =
                                     (uint)bVar81 * auVar89._0_4_ |
                                     (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x100);
                                bVar81 = (bool)((byte)(uVar72 >> 1) & 1);
                                auVar125._4_4_ =
                                     (uint)bVar81 * auVar89._4_4_ |
                                     (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x104);
                                bVar81 = (bool)((byte)(uVar72 >> 2) & 1);
                                auVar125._8_4_ =
                                     (uint)bVar81 * auVar89._8_4_ |
                                     (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x108);
                                bVar81 = (bool)((byte)(uVar72 >> 3) & 1);
                                auVar125._12_4_ =
                                     (uint)bVar81 * auVar89._12_4_ |
                                     (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x10c);
                                bVar81 = (bool)((byte)(uVar72 >> 4) & 1);
                                auVar125._16_4_ =
                                     (uint)bVar81 * auVar89._16_4_ |
                                     (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x110);
                                bVar81 = (bool)((byte)(uVar72 >> 5) & 1);
                                auVar125._20_4_ =
                                     (uint)bVar81 * auVar89._20_4_ |
                                     (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x114);
                                bVar81 = (bool)((byte)(uVar72 >> 6) & 1);
                                auVar125._24_4_ =
                                     (uint)bVar81 * auVar89._24_4_ |
                                     (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x118);
                                bVar81 = SUB81(uVar72 >> 7,0);
                                auVar125._28_4_ =
                                     (uint)bVar81 * auVar89._28_4_ |
                                     (uint)!bVar81 * *(int *)(local_5d00._24_8_ + 0x11c);
                                *(undefined1 (*) [32])(local_5d00._24_8_ + 0x100) = auVar125;
                              }
                              bVar74 = (byte)uVar72;
                              auVar127._0_4_ =
                                   (uint)(bVar74 & 1) * *(int *)local_5d30 |
                                   (uint)!(bool)(bVar74 & 1) * local_5c80._0_4_;
                              bVar81 = (bool)((byte)(uVar72 >> 1) & 1);
                              auVar127._4_4_ =
                                   (uint)bVar81 * *(int *)(local_5d30 + 4) |
                                   (uint)!bVar81 * local_5c80._4_4_;
                              bVar81 = (bool)((byte)(uVar72 >> 2) & 1);
                              auVar127._8_4_ =
                                   (uint)bVar81 * *(int *)(local_5d30 + 8) |
                                   (uint)!bVar81 * local_5c80._8_4_;
                              bVar81 = (bool)((byte)(uVar72 >> 3) & 1);
                              auVar127._12_4_ =
                                   (uint)bVar81 * *(int *)(local_5d30 + 0xc) |
                                   (uint)!bVar81 * local_5c80._12_4_;
                              bVar81 = (bool)((byte)(uVar72 >> 4) & 1);
                              auVar127._16_4_ =
                                   (uint)bVar81 * *(int *)(local_5d30 + 0x10) |
                                   (uint)!bVar81 * local_5c80._16_4_;
                              bVar81 = (bool)((byte)(uVar72 >> 5) & 1);
                              auVar127._20_4_ =
                                   (uint)bVar81 * *(int *)(local_5d30 + 0x14) |
                                   (uint)!bVar81 * local_5c80._20_4_;
                              bVar81 = (bool)((byte)(uVar72 >> 6) & 1);
                              auVar127._24_4_ =
                                   (uint)bVar81 * *(int *)(local_5d30 + 0x18) |
                                   (uint)!bVar81 * local_5c80._24_4_;
                              bVar81 = (bool)((byte)(uVar72 >> 7) & 1);
                              auVar127._28_4_ =
                                   (uint)bVar81 * *(int *)(local_5d30 + 0x1c) |
                                   (uint)!bVar81 * local_5c80._28_4_;
                              in_ZMM10 = ZEXT3264(auVar127);
                              *(undefined1 (*) [32])local_5d30 = auVar127;
                            }
                            bVar77 = bVar77 & ~bVar74;
                          }
                        }
                      }
                      if ((bVar77 == 0) || (bVar81 = 2 < uVar73, uVar73 = uVar73 + 1, bVar81))
                      break;
                    }
                    bVar70 = bVar70 & bVar77;
                  } while ((bVar70 != 0) && (uVar73 = local_5c10 + 1, uVar73 < local_5c18));
                  bVar70 = ~bVar70;
                }
                bVar79 = bVar79 | bVar70;
                if (bVar79 == 0xff) {
                  bVar79 = 0xff;
                  goto LAB_007c92ee;
                }
                auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar81 = (bool)(bVar79 >> 1 & 1);
                bVar10 = (bool)(bVar79 >> 2 & 1);
                bVar11 = (bool)(bVar79 >> 3 & 1);
                bVar12 = (bool)(bVar79 >> 4 & 1);
                bVar13 = (bool)(bVar79 >> 5 & 1);
                bVar14 = (bool)(bVar79 >> 6 & 1);
                local_58a0._4_4_ = (uint)bVar81 * auVar89._4_4_ | (uint)!bVar81 * local_58a0._4_4_;
                local_58a0._0_4_ =
                     (uint)(bVar79 & 1) * auVar89._0_4_ |
                     (uint)!(bool)(bVar79 & 1) * local_58a0._0_4_;
                local_58a0._8_4_ = (uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * local_58a0._8_4_;
                local_58a0._12_4_ =
                     (uint)bVar11 * auVar89._12_4_ | (uint)!bVar11 * local_58a0._12_4_;
                local_58a0._16_4_ =
                     (uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * local_58a0._16_4_;
                local_58a0._20_4_ =
                     (uint)bVar13 * auVar89._20_4_ | (uint)!bVar13 * local_58a0._20_4_;
                local_58a0._24_4_ =
                     (uint)bVar14 * auVar89._24_4_ | (uint)!bVar14 * local_58a0._24_4_;
                local_58a0._28_4_ =
                     (uint)(bVar79 >> 7) * auVar89._28_4_ |
                     (uint)!(bool)(bVar79 >> 7) * local_58a0._28_4_;
              }
              goto LAB_007c7c56;
            }
            uVar72 = root.ptr & 0xfffffffffffffff0;
            auVar89 = auVar227._0_32_;
            do {
              uVar78 = *(ulong *)(uVar72 + 0x40 + lVar75 * 2);
              if (uVar78 == 8) break;
              uVar1 = *(undefined4 *)(uVar72 + 0x120 + lVar75);
              auVar103._4_4_ = uVar1;
              auVar103._0_4_ = uVar1;
              auVar103._8_4_ = uVar1;
              auVar103._12_4_ = uVar1;
              auVar103._16_4_ = uVar1;
              auVar103._20_4_ = uVar1;
              auVar103._24_4_ = uVar1;
              auVar103._28_4_ = uVar1;
              auVar90 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar1 = *(undefined4 *)(uVar72 + 0x60 + lVar75);
              auVar91._4_4_ = uVar1;
              auVar91._0_4_ = uVar1;
              auVar91._8_4_ = uVar1;
              auVar91._12_4_ = uVar1;
              auVar91._16_4_ = uVar1;
              auVar91._20_4_ = uVar1;
              auVar91._24_4_ = uVar1;
              auVar91._28_4_ = uVar1;
              auVar91 = vfmadd213ps_avx512vl(auVar103,auVar90,auVar91);
              uVar1 = *(undefined4 *)(uVar72 + 0x160 + lVar75);
              auVar104._4_4_ = uVar1;
              auVar104._0_4_ = uVar1;
              auVar104._8_4_ = uVar1;
              auVar104._12_4_ = uVar1;
              auVar104._16_4_ = uVar1;
              auVar104._20_4_ = uVar1;
              auVar104._24_4_ = uVar1;
              auVar104._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar72 + 0xa0 + lVar75);
              auVar92._4_4_ = uVar1;
              auVar92._0_4_ = uVar1;
              auVar92._8_4_ = uVar1;
              auVar92._12_4_ = uVar1;
              auVar92._16_4_ = uVar1;
              auVar92._20_4_ = uVar1;
              auVar92._24_4_ = uVar1;
              auVar92._28_4_ = uVar1;
              auVar92 = vfmadd213ps_avx512vl(auVar104,auVar90,auVar92);
              uVar1 = *(undefined4 *)(uVar72 + 0x1a0 + lVar75);
              auVar105._4_4_ = uVar1;
              auVar105._0_4_ = uVar1;
              auVar105._8_4_ = uVar1;
              auVar105._12_4_ = uVar1;
              auVar105._16_4_ = uVar1;
              auVar105._20_4_ = uVar1;
              auVar105._24_4_ = uVar1;
              auVar105._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar72 + 0xe0 + lVar75);
              auVar94._4_4_ = uVar1;
              auVar94._0_4_ = uVar1;
              auVar94._8_4_ = uVar1;
              auVar94._12_4_ = uVar1;
              auVar94._16_4_ = uVar1;
              auVar94._20_4_ = uVar1;
              auVar94._24_4_ = uVar1;
              auVar94._28_4_ = uVar1;
              auVar93 = vfmadd213ps_avx512vl(auVar105,auVar90,auVar94);
              uVar1 = *(undefined4 *)(uVar72 + 0x140 + lVar75);
              auVar106._4_4_ = uVar1;
              auVar106._0_4_ = uVar1;
              auVar106._8_4_ = uVar1;
              auVar106._12_4_ = uVar1;
              auVar106._16_4_ = uVar1;
              auVar106._20_4_ = uVar1;
              auVar106._24_4_ = uVar1;
              auVar106._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar72 + 0x80 + lVar75);
              auVar95._4_4_ = uVar1;
              auVar95._0_4_ = uVar1;
              auVar95._8_4_ = uVar1;
              auVar95._12_4_ = uVar1;
              auVar95._16_4_ = uVar1;
              auVar95._20_4_ = uVar1;
              auVar95._24_4_ = uVar1;
              auVar95._28_4_ = uVar1;
              auVar94 = vfmadd213ps_avx512vl(auVar106,auVar90,auVar95);
              uVar1 = *(undefined4 *)(uVar72 + 0x180 + lVar75);
              auVar107._4_4_ = uVar1;
              auVar107._0_4_ = uVar1;
              auVar107._8_4_ = uVar1;
              auVar107._12_4_ = uVar1;
              auVar107._16_4_ = uVar1;
              auVar107._20_4_ = uVar1;
              auVar107._24_4_ = uVar1;
              auVar107._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar72 + 0xc0 + lVar75);
              auVar96._4_4_ = uVar1;
              auVar96._0_4_ = uVar1;
              auVar96._8_4_ = uVar1;
              auVar96._12_4_ = uVar1;
              auVar96._16_4_ = uVar1;
              auVar96._20_4_ = uVar1;
              auVar96._24_4_ = uVar1;
              auVar96._28_4_ = uVar1;
              auVar95 = vfmadd213ps_avx512vl(auVar107,auVar90,auVar96);
              uVar1 = *(undefined4 *)(uVar72 + 0x1c0 + lVar75);
              auVar108._4_4_ = uVar1;
              auVar108._0_4_ = uVar1;
              auVar108._8_4_ = uVar1;
              auVar108._12_4_ = uVar1;
              auVar108._16_4_ = uVar1;
              auVar108._20_4_ = uVar1;
              auVar108._24_4_ = uVar1;
              auVar108._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar72 + 0x100 + lVar75);
              auVar117._4_4_ = uVar1;
              auVar117._0_4_ = uVar1;
              auVar117._8_4_ = uVar1;
              auVar117._12_4_ = uVar1;
              auVar117._16_4_ = uVar1;
              auVar117._20_4_ = uVar1;
              auVar117._24_4_ = uVar1;
              auVar117._28_4_ = uVar1;
              auVar96 = vfmadd213ps_avx512vl(auVar108,auVar90,auVar117);
              in_ZMM8 = ZEXT3264(auVar96);
              auVar100._8_8_ = local_5a40._8_8_;
              auVar100._0_8_ = local_5a40._0_8_;
              auVar100._16_8_ = local_5a40._16_8_;
              auVar100._24_8_ = local_5a40._24_8_;
              in_ZMM9 = ZEXT3264(auVar100);
              auVar101._8_8_ = local_5a40._40_8_;
              auVar101._0_8_ = local_5a40._32_8_;
              auVar101._16_8_ = local_5a40._48_8_;
              auVar101._24_8_ = local_5a40._56_8_;
              in_ZMM10 = ZEXT3264(auVar101);
              auVar102._8_8_ = local_5a40._72_8_;
              auVar102._0_8_ = local_5a40._64_8_;
              auVar102._16_8_ = local_5a40._80_8_;
              auVar102._24_8_ = local_5a40._88_8_;
              in_ZMM11 = ZEXT3264(auVar102);
              in_ZMM12 = ZEXT3264(local_5980);
              auVar91 = vsubps_avx(auVar91,auVar100);
              auVar154._0_4_ = local_5980._0_4_ * auVar91._0_4_;
              auVar154._4_4_ = local_5980._4_4_ * auVar91._4_4_;
              auVar154._8_4_ = local_5980._8_4_ * auVar91._8_4_;
              auVar154._12_4_ = local_5980._12_4_ * auVar91._12_4_;
              auVar154._16_4_ = local_5980._16_4_ * auVar91._16_4_;
              auVar154._20_4_ = local_5980._20_4_ * auVar91._20_4_;
              auVar154._28_36_ = in_ZMM13._28_36_;
              auVar154._24_4_ = local_5980._24_4_ * auVar91._24_4_;
              auVar117 = auVar154._0_32_;
              in_ZMM13 = ZEXT3264(auVar117);
              auVar91 = vsubps_avx(auVar92,auVar101);
              auVar163._0_4_ = auVar91._0_4_ * (float)local_5960._0_4_;
              auVar163._4_4_ = auVar91._4_4_ * (float)local_5960._4_4_;
              auVar163._8_4_ = auVar91._8_4_ * fStack_5958;
              auVar163._12_4_ = auVar91._12_4_ * fStack_5954;
              auVar163._16_4_ = auVar91._16_4_ * fStack_5950;
              auVar163._20_4_ = auVar91._20_4_ * fStack_594c;
              auVar163._28_36_ = in_ZMM14._28_36_;
              auVar163._24_4_ = auVar91._24_4_ * fStack_5948;
              auVar103 = auVar163._0_32_;
              in_ZMM14 = ZEXT3264(auVar103);
              auVar91 = vsubps_avx(auVar93,auVar102);
              auVar172._0_4_ = auVar91._0_4_ * (float)local_5940._0_4_;
              auVar172._4_4_ = auVar91._4_4_ * (float)local_5940._4_4_;
              auVar172._8_4_ = auVar91._8_4_ * fStack_5938;
              auVar172._12_4_ = auVar91._12_4_ * fStack_5934;
              auVar172._16_4_ = auVar91._16_4_ * fStack_5930;
              auVar172._20_4_ = auVar91._20_4_ * fStack_592c;
              auVar172._28_36_ = in_ZMM15._28_36_;
              auVar172._24_4_ = auVar91._24_4_ * fStack_5928;
              auVar104 = auVar172._0_32_;
              in_ZMM15 = ZEXT3264(auVar104);
              auVar91 = vsubps_avx(auVar94,auVar100);
              auVar120._4_4_ = local_5980._4_4_ * auVar91._4_4_;
              auVar120._0_4_ = local_5980._0_4_ * auVar91._0_4_;
              auVar120._8_4_ = local_5980._8_4_ * auVar91._8_4_;
              auVar120._12_4_ = local_5980._12_4_ * auVar91._12_4_;
              auVar120._16_4_ = local_5980._16_4_ * auVar91._16_4_;
              auVar120._20_4_ = local_5980._20_4_ * auVar91._20_4_;
              auVar120._24_4_ = local_5980._24_4_ * auVar91._24_4_;
              auVar120._28_4_ = auVar94._28_4_;
              auVar91 = vsubps_avx(auVar95,auVar101);
              auVar111._4_4_ = auVar91._4_4_ * (float)local_5960._4_4_;
              auVar111._0_4_ = auVar91._0_4_ * (float)local_5960._0_4_;
              auVar111._8_4_ = auVar91._8_4_ * fStack_5958;
              auVar111._12_4_ = auVar91._12_4_ * fStack_5954;
              auVar111._16_4_ = auVar91._16_4_ * fStack_5950;
              auVar111._20_4_ = auVar91._20_4_ * fStack_594c;
              auVar111._24_4_ = auVar91._24_4_ * fStack_5948;
              auVar111._28_4_ = uStack_5944;
              auVar91 = vsubps_avx(auVar96,auVar102);
              auVar112._4_4_ = auVar91._4_4_ * (float)local_5940._4_4_;
              auVar112._0_4_ = auVar91._0_4_ * (float)local_5940._0_4_;
              auVar112._8_4_ = auVar91._8_4_ * fStack_5938;
              auVar112._12_4_ = auVar91._12_4_ * fStack_5934;
              auVar112._16_4_ = auVar91._16_4_ * fStack_5930;
              auVar112._20_4_ = auVar91._20_4_ * fStack_592c;
              auVar112._24_4_ = auVar91._24_4_ * fStack_5928;
              auVar112._28_4_ = uStack_5924;
              auVar91 = vpminsd_avx2(auVar117,auVar120);
              auVar92 = vpminsd_avx2(auVar103,auVar111);
              auVar91 = vpmaxsd_avx2(auVar91,auVar92);
              auVar92 = vpminsd_avx2(auVar104,auVar112);
              in_ZMM7 = ZEXT3264(auVar92);
              auVar91 = vpmaxsd_avx2(auVar91,auVar92);
              auVar93 = vmulps_avx512vl(auVar91,auVar228._0_32_);
              auVar91 = vpmaxsd_avx2(auVar117,auVar120);
              auVar172 = ZEXT3264(auVar91);
              auVar92 = vpmaxsd_avx2(auVar103,auVar111);
              auVar92 = vpminsd_avx2(auVar91,auVar92);
              auVar91 = vpmaxsd_avx2(auVar104,auVar112);
              auVar91 = vpminsd_avx2(auVar92,auVar91);
              auVar92 = vmulps_avx512vl(auVar91,auVar229._0_32_);
              auVar91 = vpmaxsd_avx2(auVar93,local_58c0);
              auVar154 = ZEXT3264(auVar91);
              auVar92 = vpminsd_avx2(auVar92,local_58a0);
              auVar163 = ZEXT3264(auVar92);
              uVar83 = vcmpps_avx512vl(auVar91,auVar92,2);
              if (((uint)root.ptr & 7) == 6) {
                uVar1 = *(undefined4 *)(uVar72 + 0x1e0 + lVar75);
                auVar109._4_4_ = uVar1;
                auVar109._0_4_ = uVar1;
                auVar109._8_4_ = uVar1;
                auVar109._12_4_ = uVar1;
                auVar109._16_4_ = uVar1;
                auVar109._20_4_ = uVar1;
                auVar109._24_4_ = uVar1;
                auVar109._28_4_ = uVar1;
                uVar17 = vcmpps_avx512vl(auVar90,auVar109,0xd);
                uVar1 = *(undefined4 *)(uVar72 + 0x200 + lVar75);
                auVar110._4_4_ = uVar1;
                auVar110._0_4_ = uVar1;
                auVar110._8_4_ = uVar1;
                auVar110._12_4_ = uVar1;
                auVar110._16_4_ = uVar1;
                auVar110._20_4_ = uVar1;
                auVar110._24_4_ = uVar1;
                auVar110._28_4_ = uVar1;
                uVar18 = vcmpps_avx512vl(auVar90,auVar110,1);
                uVar83 = uVar83 & uVar17 & uVar18;
              }
              uVar17 = vcmpps_avx512vl(local_58a0,auVar221._0_32_,6);
              uVar83 = uVar83 & uVar17;
              uVar17 = uVar73;
              auVar113 = auVar89;
              if ((byte)uVar83 != 0) {
                auVar91 = vblendmps_avx512vl(auVar227._0_32_,auVar93);
                bVar81 = (bool)((byte)uVar83 & 1);
                auVar113._0_4_ = (uint)bVar81 * auVar91._0_4_ | (uint)!bVar81 * auVar90._0_4_;
                bVar81 = (bool)((byte)(uVar83 >> 1) & 1);
                auVar113._4_4_ = (uint)bVar81 * auVar91._4_4_ | (uint)!bVar81 * auVar90._4_4_;
                bVar81 = (bool)((byte)(uVar83 >> 2) & 1);
                auVar113._8_4_ = (uint)bVar81 * auVar91._8_4_ | (uint)!bVar81 * auVar90._8_4_;
                bVar81 = (bool)((byte)(uVar83 >> 3) & 1);
                auVar113._12_4_ = (uint)bVar81 * auVar91._12_4_ | (uint)!bVar81 * auVar90._12_4_;
                bVar81 = (bool)((byte)(uVar83 >> 4) & 1);
                auVar113._16_4_ = (uint)bVar81 * auVar91._16_4_ | (uint)!bVar81 * auVar90._16_4_;
                bVar81 = (bool)((byte)(uVar83 >> 5) & 1);
                auVar113._20_4_ = (uint)bVar81 * auVar91._20_4_ | (uint)!bVar81 * auVar90._20_4_;
                bVar81 = (bool)((byte)(uVar83 >> 6) & 1);
                auVar113._24_4_ = (uint)bVar81 * auVar91._24_4_ | (uint)!bVar81 * auVar90._24_4_;
                bVar81 = SUB81(uVar83 >> 7,0);
                auVar113._28_4_ = (uint)bVar81 * auVar91._28_4_ | (uint)!bVar81 * auVar90._28_4_;
                uVar17 = uVar78;
                if (uVar73 != 8) {
                  *puVar80 = uVar73;
                  puVar80 = puVar80 + 1;
                  *pauVar76 = auVar89;
                  pauVar76 = pauVar76 + 1;
                }
              }
              auVar89 = auVar113;
              uVar73 = uVar17;
              lVar75 = lVar75 + 4;
            } while (lVar75 != 0);
            if (uVar73 == 8) goto LAB_007c7eb2;
            uVar19 = vcmpps_avx512vl(auVar89,local_58a0,9);
            auVar221 = ZEXT3264(auVar89);
            root.ptr = uVar73;
          } while ((byte)uVar82 < (byte)POPCOUNT((int)uVar19));
          *puVar80 = uVar73;
          puVar80 = puVar80 + 1;
          *pauVar76 = auVar89;
          pauVar76 = pauVar76 + 1;
LAB_007c7eb2:
          iVar71 = 4;
        }
        else {
          local_5c60._0_8_ = uVar72;
          do {
            k = 0;
            for (uVar72 = uVar73; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            auVar154 = ZEXT1664(auVar154._0_16_);
            auVar163 = ZEXT1664(auVar163._0_16_);
            auVar172 = ZEXT1664(auVar172._0_16_);
            in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
            in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar81 = occluded1(local_5c20,local_5c28,root,k,&local_5d41,ray,
                               (TravRayK<8,_true> *)&local_5a40.field_0,context);
            bVar70 = (byte)(1 << ((uint)k & 0x1f));
            if (!bVar81) {
              bVar70 = 0;
            }
            bVar79 = bVar79 | bVar70;
            uVar73 = uVar73 - 1 & uVar73;
          } while (uVar73 != 0);
          iVar71 = 3;
          if (bVar79 != 0xff) {
            auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            local_58a0._0_4_ =
                 (uint)(bVar79 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar79 & 1) * local_58a0._0_4_;
            bVar81 = (bool)(bVar79 >> 1 & 1);
            local_58a0._4_4_ = (uint)bVar81 * auVar89._4_4_ | (uint)!bVar81 * local_58a0._4_4_;
            bVar81 = (bool)(bVar79 >> 2 & 1);
            local_58a0._8_4_ = (uint)bVar81 * auVar89._8_4_ | (uint)!bVar81 * local_58a0._8_4_;
            bVar81 = (bool)(bVar79 >> 3 & 1);
            local_58a0._12_4_ = (uint)bVar81 * auVar89._12_4_ | (uint)!bVar81 * local_58a0._12_4_;
            bVar81 = (bool)(bVar79 >> 4 & 1);
            local_58a0._16_4_ = (uint)bVar81 * auVar89._16_4_ | (uint)!bVar81 * local_58a0._16_4_;
            bVar81 = (bool)(bVar79 >> 5 & 1);
            local_58a0._20_4_ = (uint)bVar81 * auVar89._20_4_ | (uint)!bVar81 * local_58a0._20_4_;
            bVar81 = (bool)(bVar79 >> 6 & 1);
            local_58a0._24_4_ = (uint)bVar81 * auVar89._24_4_ | (uint)!bVar81 * local_58a0._24_4_;
            local_58a0._28_4_ =
                 (uint)(bVar79 >> 7) * auVar89._28_4_ |
                 (uint)!(bool)(bVar79 >> 7) * local_58a0._28_4_;
            iVar71 = 2;
          }
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar225 = ZEXT3264(auVar89);
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar226 = ZEXT3264(auVar89);
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar227 = ZEXT3264(auVar89);
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar228 = ZEXT3264(auVar89);
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar229 = ZEXT3264(auVar89);
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
          auVar224 = ZEXT3264(auVar89);
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar223 = ZEXT3264(auVar89);
          auVar221 = ZEXT3264(local_5c80);
          if ((uint)uVar82 < (uint)local_5c60._0_4_) goto LAB_007c7c9e;
        }
      } while (iVar71 != 3);
LAB_007c92ee:
      bVar79 = bVar79 & (byte)local_5d24;
      bVar81 = (bool)(bVar79 >> 1 & 1);
      bVar10 = (bool)(bVar79 >> 2 & 1);
      bVar11 = (bool)(bVar79 >> 3 & 1);
      bVar12 = (bool)(bVar79 >> 4 & 1);
      bVar13 = (bool)(bVar79 >> 5 & 1);
      bVar14 = (bool)(bVar79 >> 6 & 1);
      *(uint *)local_5d30 =
           (uint)(bVar79 & 1) * -0x800000 | (uint)!(bool)(bVar79 & 1) * *(int *)local_5d30;
      *(uint *)(local_5d30 + 4) =
           (uint)bVar81 * -0x800000 | (uint)!bVar81 * *(int *)(local_5d30 + 4);
      *(uint *)(local_5d30 + 8) =
           (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(local_5d30 + 8);
      *(uint *)(local_5d30 + 0xc) =
           (uint)bVar11 * -0x800000 | (uint)!bVar11 * *(int *)(local_5d30 + 0xc);
      *(uint *)(local_5d30 + 0x10) =
           (uint)bVar12 * -0x800000 | (uint)!bVar12 * *(int *)(local_5d30 + 0x10);
      *(uint *)(local_5d30 + 0x14) =
           (uint)bVar13 * -0x800000 | (uint)!bVar13 * *(int *)(local_5d30 + 0x14);
      *(uint *)(local_5d30 + 0x18) =
           (uint)bVar14 * -0x800000 | (uint)!bVar14 * *(int *)(local_5d30 + 0x18);
      *(uint *)(local_5d30 + 0x1c) =
           (uint)(bVar79 >> 7) * -0x800000 |
           (uint)!(bool)(bVar79 >> 7) * *(int *)(local_5d30 + 0x1c);
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }